

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar33;
  uint uVar34;
  long lVar35;
  uint uVar36;
  ulong uVar37;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar38;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  int iVar99;
  float t1;
  float fVar100;
  undefined1 auVar101 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined4 uVar106;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vfloat4 a0_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  vfloat4 b0;
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  vfloat4 a0_3;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  __m128 a_1;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar199;
  float fVar200;
  __m128 a;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar207;
  float fVar216;
  float fVar217;
  vfloat4 a0_1;
  undefined1 auVar208 [16];
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  float fVar227;
  float fVar228;
  vfloat4 a0;
  undefined1 auVar220 [16];
  float fVar229;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 in_ZMM15 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  int iVar245;
  undefined1 in_ZMM31 [64];
  undefined1 auVar246 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_398;
  undefined8 uStack_390;
  RayQueryContext *local_380;
  RTCFilterFunctionNArguments local_378;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  uint auStack_2f8 [4];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint uStack_168;
  float afStack_164 [7];
  RTCHitN local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar32;
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar226 [32];
  
  PVar4 = prim[1];
  uVar38 = (ulong)(byte)PVar4;
  fVar126 = *(float *)(prim + uVar38 * 0x19 + 0x12);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar40 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar42 = vsubps_avx(auVar39,*(undefined1 (*) [16])(prim + uVar38 * 0x19 + 6));
  fVar125 = fVar126 * auVar42._0_4_;
  fVar100 = fVar126 * auVar40._0_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar38 * 4 + 6);
  auVar74 = vpmovsxbd_avx2(auVar39);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar38 * 5 + 6);
  auVar72 = vpmovsxbd_avx2(auVar48);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar38 * 6 + 6);
  auVar75 = vpmovsxbd_avx2(auVar3);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar38 * 0xb + 6);
  auVar82 = vpmovsxbd_avx2(auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar70 = vpmovsxbd_avx2(auVar50);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vcvtdq2ps_avx(auVar70);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar38 + 6);
  auVar73 = vpmovsxbd_avx2(auVar45);
  auVar73 = vcvtdq2ps_avx(auVar73);
  uVar37 = (ulong)(uint)((int)(uVar38 * 9) * 2);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar37 + 6);
  auVar76 = vpmovsxbd_avx2(auVar51);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar37 + uVar38 + 6);
  auVar77 = vpmovsxbd_avx2(auVar52);
  auVar77 = vcvtdq2ps_avx(auVar77);
  uVar31 = (ulong)(uint)((int)(uVar38 * 5) << 2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar71 = vpmovsxbd_avx2(auVar41);
  auVar78 = vcvtdq2ps_avx(auVar71);
  auVar132._4_4_ = fVar100;
  auVar132._0_4_ = fVar100;
  auVar132._8_4_ = fVar100;
  auVar132._12_4_ = fVar100;
  auVar132._16_4_ = fVar100;
  auVar132._20_4_ = fVar100;
  auVar132._24_4_ = fVar100;
  auVar132._28_4_ = fVar100;
  auVar66 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar243 = ZEXT3264(auVar66);
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar244 = ZEXT3264(auVar67);
  auVar79 = ZEXT1632(CONCAT412(fVar126 * auVar40._12_4_,
                               CONCAT48(fVar126 * auVar40._8_4_,
                                        CONCAT44(fVar126 * auVar40._4_4_,fVar100))));
  auVar68 = vpermps_avx512vl(auVar66,auVar79);
  auVar69 = vpermps_avx512vl(auVar67,auVar79);
  fVar100 = auVar69._0_4_;
  fVar184 = auVar69._4_4_;
  auVar79._4_4_ = fVar184 * auVar75._4_4_;
  auVar79._0_4_ = fVar100 * auVar75._0_4_;
  fVar199 = auVar69._8_4_;
  auVar79._8_4_ = fVar199 * auVar75._8_4_;
  fVar200 = auVar69._12_4_;
  auVar79._12_4_ = fVar200 * auVar75._12_4_;
  fVar102 = auVar69._16_4_;
  auVar79._16_4_ = fVar102 * auVar75._16_4_;
  fVar103 = auVar69._20_4_;
  auVar79._20_4_ = fVar103 * auVar75._20_4_;
  fVar104 = auVar69._24_4_;
  auVar79._24_4_ = fVar104 * auVar75._24_4_;
  auVar79._28_4_ = auVar70._28_4_;
  auVar70._4_4_ = auVar73._4_4_ * fVar184;
  auVar70._0_4_ = auVar73._0_4_ * fVar100;
  auVar70._8_4_ = auVar73._8_4_ * fVar199;
  auVar70._12_4_ = auVar73._12_4_ * fVar200;
  auVar70._16_4_ = auVar73._16_4_ * fVar102;
  auVar70._20_4_ = auVar73._20_4_ * fVar103;
  auVar70._24_4_ = auVar73._24_4_ * fVar104;
  auVar70._28_4_ = auVar71._28_4_;
  auVar71._4_4_ = auVar78._4_4_ * fVar184;
  auVar71._0_4_ = auVar78._0_4_ * fVar100;
  auVar71._8_4_ = auVar78._8_4_ * fVar199;
  auVar71._12_4_ = auVar78._12_4_ * fVar200;
  auVar71._16_4_ = auVar78._16_4_ * fVar102;
  auVar71._20_4_ = auVar78._20_4_ * fVar103;
  auVar71._24_4_ = auVar78._24_4_ * fVar104;
  auVar71._28_4_ = auVar69._28_4_;
  auVar39 = vfmadd231ps_fma(auVar79,auVar68,auVar72);
  auVar48 = vfmadd231ps_fma(auVar70,auVar68,auVar83);
  auVar3 = vfmadd231ps_fma(auVar71,auVar77,auVar68);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar132,auVar74);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar132,auVar82);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar76,auVar132);
  auVar140._4_4_ = fVar125;
  auVar140._0_4_ = fVar125;
  auVar140._8_4_ = fVar125;
  auVar140._12_4_ = fVar125;
  auVar140._16_4_ = fVar125;
  auVar140._20_4_ = fVar125;
  auVar140._24_4_ = fVar125;
  auVar140._28_4_ = fVar125;
  auVar71 = ZEXT1632(CONCAT412(fVar126 * auVar42._12_4_,
                               CONCAT48(fVar126 * auVar42._8_4_,
                                        CONCAT44(fVar126 * auVar42._4_4_,fVar125))));
  auVar70 = vpermps_avx512vl(auVar66,auVar71);
  auVar71 = vpermps_avx512vl(auVar67,auVar71);
  fVar126 = auVar71._0_4_;
  auVar237._0_4_ = fVar126 * auVar75._0_4_;
  fVar100 = auVar71._4_4_;
  auVar237._4_4_ = fVar100 * auVar75._4_4_;
  fVar184 = auVar71._8_4_;
  auVar237._8_4_ = fVar184 * auVar75._8_4_;
  fVar199 = auVar71._12_4_;
  auVar237._12_4_ = fVar199 * auVar75._12_4_;
  fVar200 = auVar71._16_4_;
  auVar237._16_4_ = fVar200 * auVar75._16_4_;
  fVar102 = auVar71._20_4_;
  auVar237._20_4_ = fVar102 * auVar75._20_4_;
  fVar103 = auVar71._24_4_;
  auVar237._28_36_ = in_ZMM15._28_36_;
  auVar237._24_4_ = fVar103 * auVar75._24_4_;
  auVar66._4_4_ = auVar73._4_4_ * fVar100;
  auVar66._0_4_ = auVar73._0_4_ * fVar126;
  auVar66._8_4_ = auVar73._8_4_ * fVar184;
  auVar66._12_4_ = auVar73._12_4_ * fVar199;
  auVar66._16_4_ = auVar73._16_4_ * fVar200;
  auVar66._20_4_ = auVar73._20_4_ * fVar102;
  auVar66._24_4_ = auVar73._24_4_ * fVar103;
  auVar66._28_4_ = auVar75._28_4_;
  auVar73._4_4_ = auVar78._4_4_ * fVar100;
  auVar73._0_4_ = auVar78._0_4_ * fVar126;
  auVar73._8_4_ = auVar78._8_4_ * fVar184;
  auVar73._12_4_ = auVar78._12_4_ * fVar199;
  auVar73._16_4_ = auVar78._16_4_ * fVar200;
  auVar73._20_4_ = auVar78._20_4_ * fVar102;
  auVar73._24_4_ = auVar78._24_4_ * fVar103;
  auVar73._28_4_ = auVar71._28_4_;
  auVar49 = vfmadd231ps_fma(auVar237._0_32_,auVar70,auVar72);
  auVar50 = vfmadd231ps_fma(auVar66,auVar70,auVar83);
  auVar45 = vfmadd231ps_fma(auVar73,auVar70,auVar77);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar140,auVar74);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar140,auVar82);
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  auVar84._16_4_ = 0x7fffffff;
  auVar84._20_4_ = 0x7fffffff;
  auVar84._24_4_ = 0x7fffffff;
  auVar84._28_4_ = 0x7fffffff;
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar140,auVar76);
  auVar74 = vandps_avx(ZEXT1632(auVar39),auVar84);
  auVar86._8_4_ = 0x219392ef;
  auVar86._0_8_ = 0x219392ef219392ef;
  auVar86._12_4_ = 0x219392ef;
  auVar86._16_4_ = 0x219392ef;
  auVar86._20_4_ = 0x219392ef;
  auVar86._24_4_ = 0x219392ef;
  auVar86._28_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar74,auVar86,1);
  bVar13 = (bool)((byte)uVar37 & 1);
  auVar67._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._0_4_;
  bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._4_4_;
  bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._8_4_;
  bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar39._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar48),auVar84);
  uVar37 = vcmpps_avx512vl(auVar74,auVar86,1);
  bVar13 = (bool)((byte)uVar37 & 1);
  auVar68._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._0_4_;
  bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._4_4_;
  bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._8_4_;
  bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar48._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar74 = vandps_avx(ZEXT1632(auVar3),auVar84);
  uVar37 = vcmpps_avx512vl(auVar74,auVar86,1);
  bVar13 = (bool)((byte)uVar37 & 1);
  auVar74._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar3._0_4_;
  bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar3._4_4_;
  bVar13 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar3._8_4_;
  bVar13 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar3._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar72 = vrcp14ps_avx512vl(auVar67);
  auVar85._8_4_ = 0x3f800000;
  auVar85._0_8_ = &DAT_3f8000003f800000;
  auVar85._12_4_ = 0x3f800000;
  auVar85._16_4_ = 0x3f800000;
  auVar85._20_4_ = 0x3f800000;
  auVar85._24_4_ = 0x3f800000;
  auVar85._28_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar67,auVar72,auVar85);
  auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar68);
  auVar48 = vfnmadd213ps_fma(auVar68,auVar72,auVar85);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar74);
  auVar3 = vfnmadd213ps_fma(auVar74,auVar72,auVar85);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar72,auVar72);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 7 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar49));
  auVar76._4_4_ = auVar39._4_4_ * auVar74._4_4_;
  auVar76._0_4_ = auVar39._0_4_ * auVar74._0_4_;
  auVar76._8_4_ = auVar39._8_4_ * auVar74._8_4_;
  auVar76._12_4_ = auVar39._12_4_ * auVar74._12_4_;
  auVar76._16_4_ = auVar74._16_4_ * 0.0;
  auVar76._20_4_ = auVar74._20_4_ * 0.0;
  auVar76._24_4_ = auVar74._24_4_ * 0.0;
  auVar76._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 9 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar49));
  auVar73 = vpbroadcastd_avx512vl();
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar81._0_4_ = auVar39._0_4_ * auVar74._0_4_;
  auVar81._4_4_ = auVar39._4_4_ * auVar74._4_4_;
  auVar81._8_4_ = auVar39._8_4_ * auVar74._8_4_;
  auVar81._12_4_ = auVar39._12_4_ * auVar74._12_4_;
  auVar81._16_4_ = auVar74._16_4_ * 0.0;
  auVar81._20_4_ = auVar74._20_4_ * 0.0;
  auVar81._24_4_ = auVar74._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar38 * -2 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar50));
  auVar77._4_4_ = auVar48._4_4_ * auVar74._4_4_;
  auVar77._0_4_ = auVar48._0_4_ * auVar74._0_4_;
  auVar77._8_4_ = auVar48._8_4_ * auVar74._8_4_;
  auVar77._12_4_ = auVar48._12_4_ * auVar74._12_4_;
  auVar77._16_4_ = auVar74._16_4_ * 0.0;
  auVar77._20_4_ = auVar74._20_4_ * 0.0;
  auVar77._24_4_ = auVar74._24_4_ * 0.0;
  auVar77._28_4_ = auVar74._28_4_;
  auVar74 = vcvtdq2ps_avx(auVar72);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar50));
  auVar80._0_4_ = auVar48._0_4_ * auVar74._0_4_;
  auVar80._4_4_ = auVar48._4_4_ * auVar74._4_4_;
  auVar80._8_4_ = auVar48._8_4_ * auVar74._8_4_;
  auVar80._12_4_ = auVar48._12_4_ * auVar74._12_4_;
  auVar80._16_4_ = auVar74._16_4_ * 0.0;
  auVar80._20_4_ = auVar74._20_4_ * 0.0;
  auVar80._24_4_ = auVar74._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + uVar38 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar45));
  auVar78._4_4_ = auVar74._4_4_ * auVar3._4_4_;
  auVar78._0_4_ = auVar74._0_4_ * auVar3._0_4_;
  auVar78._8_4_ = auVar74._8_4_ * auVar3._8_4_;
  auVar78._12_4_ = auVar74._12_4_ * auVar3._12_4_;
  auVar78._16_4_ = auVar74._16_4_ * 0.0;
  auVar78._20_4_ = auVar74._20_4_ * 0.0;
  auVar78._24_4_ = auVar74._24_4_ * 0.0;
  auVar78._28_4_ = auVar74._28_4_;
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 * 0x17 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,ZEXT1632(auVar45));
  auVar69._0_4_ = auVar3._0_4_ * auVar74._0_4_;
  auVar69._4_4_ = auVar3._4_4_ * auVar74._4_4_;
  auVar69._8_4_ = auVar3._8_4_ * auVar74._8_4_;
  auVar69._12_4_ = auVar3._12_4_ * auVar74._12_4_;
  auVar69._16_4_ = auVar74._16_4_ * 0.0;
  auVar69._20_4_ = auVar74._20_4_ * 0.0;
  auVar69._24_4_ = auVar74._24_4_ * 0.0;
  auVar69._28_4_ = 0;
  auVar74 = vpminsd_avx2(auVar76,auVar81);
  auVar72 = vpminsd_avx2(auVar77,auVar80);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72 = vpminsd_avx2(auVar78,auVar69);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar75._4_4_ = uVar106;
  auVar75._0_4_ = uVar106;
  auVar75._8_4_ = uVar106;
  auVar75._12_4_ = uVar106;
  auVar75._16_4_ = uVar106;
  auVar75._20_4_ = uVar106;
  auVar75._24_4_ = uVar106;
  auVar75._28_4_ = uVar106;
  auVar72 = vmaxps_avx512vl(auVar72,auVar75);
  auVar74 = vmaxps_avx(auVar74,auVar72);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  auVar72._16_4_ = 0x3f7ffffa;
  auVar72._20_4_ = 0x3f7ffffa;
  auVar72._24_4_ = 0x3f7ffffa;
  auVar72._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar74,auVar72);
  auVar74 = vpmaxsd_avx2(auVar76,auVar81);
  auVar72 = vpmaxsd_avx2(auVar77,auVar80);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar72 = vpmaxsd_avx2(auVar78,auVar69);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar82._4_4_ = uVar106;
  auVar82._0_4_ = uVar106;
  auVar82._8_4_ = uVar106;
  auVar82._12_4_ = uVar106;
  auVar82._16_4_ = uVar106;
  auVar82._20_4_ = uVar106;
  auVar82._24_4_ = uVar106;
  auVar82._28_4_ = uVar106;
  auVar72 = vminps_avx512vl(auVar72,auVar82);
  auVar74 = vminps_avx(auVar74,auVar72);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar74 = vmulps_avx512vl(auVar74,auVar83);
  uVar16 = vpcmpgtd_avx512vl(auVar73,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_b8,auVar74,2);
  if ((byte)((byte)uVar15 & (byte)uVar16) == 0) {
    return;
  }
  uVar37 = (ulong)(byte)((byte)uVar15 & (byte)uVar16);
  local_2e8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar240 = ZEXT1664(auVar39);
  auVar39 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar246 = ZEXT1664(auVar39);
LAB_01d97f74:
  lVar35 = 0;
  for (uVar31 = uVar37; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar35 = lVar35 + 1;
  }
  uVar36 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar35 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar36].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)uVar5 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar39 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar31);
  lVar35 = uVar31 + 1;
  auVar48 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar35);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar3 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar31);
  auVar49 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar35);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar126 = *(float *)(ray + k * 4 + 0x30);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar31),
                       auVar39,auVar40);
  auVar42 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar35),
                       auVar48,auVar40);
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar31 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar3,auVar40);
  auVar44 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar35),
                       auVar49,auVar40);
  auVar107 = ZEXT816(0) << 0x40;
  auVar47._0_4_ = auVar48._0_4_ * 0.0;
  auVar47._4_4_ = auVar48._4_4_ * 0.0;
  auVar47._8_4_ = auVar48._8_4_ * 0.0;
  auVar47._12_4_ = auVar48._12_4_ * 0.0;
  auVar51 = vfmadd231ps_fma(auVar47,auVar42,auVar107);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar51);
  auVar55._0_4_ = auVar39._0_4_ + auVar45._0_4_;
  auVar55._4_4_ = auVar39._4_4_ + auVar45._4_4_;
  auVar55._8_4_ = auVar39._8_4_ + auVar45._8_4_;
  auVar55._12_4_ = auVar39._12_4_ + auVar45._12_4_;
  auVar53 = auVar237._0_16_;
  auVar45 = vfmadd231ps_avx512vl(auVar51,auVar41,auVar53);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar39,auVar53);
  auVar208._0_4_ = auVar49._0_4_ * 0.0;
  auVar208._4_4_ = auVar49._4_4_ * 0.0;
  auVar208._8_4_ = auVar49._8_4_ * 0.0;
  auVar208._12_4_ = auVar49._12_4_ * 0.0;
  auVar51 = vfmadd231ps_fma(auVar208,auVar44,auVar107);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar43,auVar51);
  auVar220._0_4_ = auVar3._0_4_ + auVar45._0_4_;
  auVar220._4_4_ = auVar3._4_4_ + auVar45._4_4_;
  auVar220._8_4_ = auVar3._8_4_ + auVar45._8_4_;
  auVar220._12_4_ = auVar3._12_4_ + auVar45._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar51,auVar43,auVar53);
  auVar47 = vfnmadd231ps_avx512vl(auVar45,auVar3,auVar53);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar42,auVar48);
  auVar45 = vfmadd231ps_fma(auVar45,auVar41,auVar107);
  auVar52 = vfmadd231ps_fma(auVar45,auVar39,auVar107);
  auVar48 = vmulps_avx512vl(auVar48,auVar53);
  auVar48 = vfnmadd231ps_avx512vl(auVar48,auVar53,auVar42);
  auVar48 = vfmadd231ps_fma(auVar48,auVar107,auVar41);
  auVar41 = vfnmadd231ps_fma(auVar48,auVar107,auVar39);
  auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar49);
  auVar39 = vfmadd231ps_fma(auVar39,auVar43,auVar107);
  auVar45 = vfmadd231ps_fma(auVar39,auVar3,auVar107);
  auVar39 = vmulps_avx512vl(auVar49,auVar53);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar53,auVar44);
  auVar39 = vfmadd231ps_fma(auVar39,auVar107,auVar43);
  auVar51 = vfnmadd231ps_fma(auVar39,auVar107,auVar3);
  auVar39 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar48 = vshufps_avx(auVar220,auVar220,0xc9);
  fVar105 = auVar46._0_4_;
  auVar59._0_4_ = fVar105 * auVar48._0_4_;
  fVar116 = auVar46._4_4_;
  auVar59._4_4_ = fVar116 * auVar48._4_4_;
  fVar117 = auVar46._8_4_;
  auVar59._8_4_ = fVar117 * auVar48._8_4_;
  fVar118 = auVar46._12_4_;
  auVar59._12_4_ = fVar118 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar59,auVar39,auVar220);
  auVar3 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar176._0_4_ = auVar48._0_4_ * fVar105;
  auVar176._4_4_ = auVar48._4_4_ * fVar116;
  auVar176._8_4_ = auVar48._8_4_ * fVar117;
  auVar176._12_4_ = auVar48._12_4_ * fVar118;
  auVar39 = vfmsub231ps_fma(auVar176,auVar39,auVar47);
  auVar49 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar48 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar100 = auVar41._0_4_;
  auVar185._0_4_ = auVar48._0_4_ * fVar100;
  fVar184 = auVar41._4_4_;
  auVar185._4_4_ = auVar48._4_4_ * fVar184;
  fVar199 = auVar41._8_4_;
  auVar185._8_4_ = auVar48._8_4_ * fVar199;
  fVar200 = auVar41._12_4_;
  auVar185._12_4_ = auVar48._12_4_ * fVar200;
  auVar48 = vfmsub231ps_fma(auVar185,auVar39,auVar45);
  auVar45 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar186._0_4_ = auVar48._0_4_ * fVar100;
  auVar186._4_4_ = auVar48._4_4_ * fVar184;
  auVar186._8_4_ = auVar48._8_4_ * fVar199;
  auVar186._12_4_ = auVar48._12_4_ * fVar200;
  auVar39 = vfmsub231ps_fma(auVar186,auVar39,auVar51);
  auVar51 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar102 = auVar39._0_4_;
  auVar187._4_12_ = ZEXT812(0) << 0x20;
  auVar187._0_4_ = fVar102;
  auVar48 = vrsqrt14ss_avx512f(auVar107,auVar187);
  auVar42 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar103 = auVar48._0_4_;
  fVar104 = auVar42._0_4_ - auVar43._0_4_ * fVar103 * fVar103 * fVar103;
  auVar48 = vdpps_avx(auVar3,auVar49,0x7f);
  fVar219 = fVar104 * auVar3._0_4_;
  fVar227 = fVar104 * auVar3._4_4_;
  fVar228 = fVar104 * auVar3._8_4_;
  fVar229 = fVar104 * auVar3._12_4_;
  auVar177._0_4_ = fVar102 * auVar49._0_4_;
  auVar177._4_4_ = fVar102 * auVar49._4_4_;
  auVar177._8_4_ = fVar102 * auVar49._8_4_;
  auVar177._12_4_ = fVar102 * auVar49._12_4_;
  fVar102 = auVar48._0_4_;
  auVar60._0_4_ = fVar102 * auVar3._0_4_;
  auVar60._4_4_ = fVar102 * auVar3._4_4_;
  auVar60._8_4_ = fVar102 * auVar3._8_4_;
  auVar60._12_4_ = fVar102 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar177,auVar60);
  auVar48 = vrcp14ss_avx512f(auVar107,auVar187);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar48,ZEXT416(0x40000000));
  fVar102 = auVar48._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar103 = auVar39._0_4_;
  auVar178._4_12_ = ZEXT812(0) << 0x20;
  auVar178._0_4_ = fVar103;
  auVar48 = vrsqrt14ss_avx512f(auVar107,auVar178);
  auVar49 = vmulss_avx512f(auVar48,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar125 = auVar48._0_4_;
  fVar125 = auVar49._0_4_ - auVar42._0_4_ * fVar125 * fVar125 * fVar125;
  auVar48 = vdpps_avx(auVar45,auVar51,0x7f);
  fVar207 = fVar125 * auVar45._0_4_;
  fVar216 = fVar125 * auVar45._4_4_;
  fVar217 = fVar125 * auVar45._8_4_;
  fVar218 = fVar125 * auVar45._12_4_;
  auVar61._0_4_ = fVar103 * auVar51._0_4_;
  auVar61._4_4_ = fVar103 * auVar51._4_4_;
  auVar61._8_4_ = fVar103 * auVar51._8_4_;
  auVar61._12_4_ = fVar103 * auVar51._12_4_;
  fVar103 = auVar48._0_4_;
  auVar63._0_4_ = fVar103 * auVar45._0_4_;
  auVar63._4_4_ = fVar103 * auVar45._4_4_;
  auVar63._8_4_ = fVar103 * auVar45._8_4_;
  auVar63._12_4_ = fVar103 * auVar45._12_4_;
  auVar49 = vsubps_avx(auVar61,auVar63);
  auVar48 = vrcp14ss_avx512f(auVar107,auVar178);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar48,ZEXT416(0x40000000));
  fVar103 = auVar39._0_4_ * auVar48._0_4_;
  auVar39 = vshufps_avx(auVar55,auVar55,0xff);
  auVar164._0_4_ = fVar219 * auVar39._0_4_;
  auVar164._4_4_ = fVar227 * auVar39._4_4_;
  auVar164._8_4_ = fVar228 * auVar39._8_4_;
  auVar164._12_4_ = fVar229 * auVar39._12_4_;
  local_208 = vsubps_avx(auVar55,auVar164);
  auVar48 = vshufps_avx(auVar46,auVar46,0xff);
  auVar56._0_4_ = auVar48._0_4_ * fVar219 + auVar39._0_4_ * fVar104 * fVar102 * auVar3._0_4_;
  auVar56._4_4_ = auVar48._4_4_ * fVar227 + auVar39._4_4_ * fVar104 * fVar102 * auVar3._4_4_;
  auVar56._8_4_ = auVar48._8_4_ * fVar228 + auVar39._8_4_ * fVar104 * fVar102 * auVar3._8_4_;
  auVar56._12_4_ = auVar48._12_4_ * fVar229 + auVar39._12_4_ * fVar104 * fVar102 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar46,auVar56);
  local_218._0_4_ = auVar164._0_4_ + auVar55._0_4_;
  local_218._4_4_ = auVar164._4_4_ + auVar55._4_4_;
  fStack_210 = auVar164._8_4_ + auVar55._8_4_;
  fStack_20c = auVar164._12_4_ + auVar55._12_4_;
  auVar42._0_4_ = fVar105 + auVar56._0_4_;
  auVar42._4_4_ = fVar116 + auVar56._4_4_;
  auVar42._8_4_ = fVar117 + auVar56._8_4_;
  auVar42._12_4_ = fVar118 + auVar56._12_4_;
  auVar39 = vshufps_avx(auVar52,auVar52,0xff);
  auVar57._0_4_ = fVar207 * auVar39._0_4_;
  auVar57._4_4_ = fVar216 * auVar39._4_4_;
  auVar57._8_4_ = fVar217 * auVar39._8_4_;
  auVar57._12_4_ = fVar218 * auVar39._12_4_;
  local_228 = vsubps_avx(auVar52,auVar57);
  auVar48 = vshufps_avx(auVar41,auVar41,0xff);
  auVar43._0_4_ = auVar48._0_4_ * fVar207 + auVar39._0_4_ * fVar125 * auVar49._0_4_ * fVar103;
  auVar43._4_4_ = auVar48._4_4_ * fVar216 + auVar39._4_4_ * fVar125 * auVar49._4_4_ * fVar103;
  auVar43._8_4_ = auVar48._8_4_ * fVar217 + auVar39._8_4_ * fVar125 * auVar49._8_4_ * fVar103;
  auVar43._12_4_ = auVar48._12_4_ * fVar218 + auVar39._12_4_ * fVar125 * auVar49._12_4_ * fVar103;
  auVar39 = vsubps_avx(auVar41,auVar43);
  _local_238 = vaddps_avx512vl(auVar52,auVar57);
  auVar44._0_4_ = fVar100 + auVar43._0_4_;
  auVar44._4_4_ = fVar184 + auVar43._4_4_;
  auVar44._8_4_ = fVar199 + auVar43._8_4_;
  auVar44._12_4_ = fVar200 + auVar43._12_4_;
  auVar48 = vmulps_avx512vl(auVar3,auVar40);
  local_248 = vaddps_avx512vl(local_208,auVar48);
  auVar39 = vmulps_avx512vl(auVar39,auVar40);
  local_258 = vsubps_avx512vl(local_228,auVar39);
  auVar39 = vmulps_avx512vl(auVar42,auVar40);
  _local_268 = vaddps_avx512vl(_local_218,auVar39);
  auVar39 = vmulps_avx512vl(auVar44,auVar40);
  _local_278 = vsubps_avx512vl(_local_238,auVar39);
  local_188 = vsubps_avx(local_208,auVar50);
  uVar106 = local_188._0_4_;
  auVar53._4_4_ = uVar106;
  auVar53._0_4_ = uVar106;
  auVar53._8_4_ = uVar106;
  auVar53._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_188,local_188,0x55);
  auVar48 = vshufps_avx(local_188,local_188,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar100 = pre->ray_space[k].vz.field_0.m128[0];
  fVar184 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = pre->ray_space[k].vz.field_0.m128[2];
  fVar200 = pre->ray_space[k].vz.field_0.m128[3];
  auVar40._0_4_ = fVar100 * auVar48._0_4_;
  auVar40._4_4_ = fVar184 * auVar48._4_4_;
  auVar40._8_4_ = fVar199 * auVar48._8_4_;
  auVar40._12_4_ = fVar200 * auVar48._12_4_;
  auVar39 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar2,auVar39);
  auVar51 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar53);
  local_198 = vsubps_avx512vl(local_248,auVar50);
  uVar106 = local_198._0_4_;
  auVar54._4_4_ = uVar106;
  auVar54._0_4_ = uVar106;
  auVar54._8_4_ = uVar106;
  auVar54._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_198,local_198,0x55);
  auVar48 = vshufps_avx(local_198,local_198,0xaa);
  auVar65._0_4_ = fVar100 * auVar48._0_4_;
  auVar65._4_4_ = fVar184 * auVar48._4_4_;
  auVar65._8_4_ = fVar199 * auVar48._8_4_;
  auVar65._12_4_ = fVar200 * auVar48._12_4_;
  auVar39 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar39);
  auVar52 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar54);
  local_1a8 = vsubps_avx512vl(local_258,auVar50);
  uVar106 = local_1a8._0_4_;
  auVar58._4_4_ = uVar106;
  auVar58._0_4_ = uVar106;
  auVar58._8_4_ = uVar106;
  auVar58._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar48 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar62._0_4_ = fVar100 * auVar48._0_4_;
  auVar62._4_4_ = fVar184 * auVar48._4_4_;
  auVar62._8_4_ = fVar199 * auVar48._8_4_;
  auVar62._12_4_ = fVar200 * auVar48._12_4_;
  auVar39 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar39);
  auVar41 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar58);
  local_1b8 = vsubps_avx(local_228,auVar50);
  uVar106 = local_1b8._0_4_;
  auVar165._4_4_ = uVar106;
  auVar165._0_4_ = uVar106;
  auVar165._8_4_ = uVar106;
  auVar165._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar48 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar148._0_4_ = fVar100 * auVar48._0_4_;
  auVar148._4_4_ = fVar184 * auVar48._4_4_;
  auVar148._8_4_ = fVar199 * auVar48._8_4_;
  auVar148._12_4_ = fVar200 * auVar48._12_4_;
  auVar39 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar2,auVar39);
  auVar40 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar165);
  local_1c8 = vsubps_avx(_local_218,auVar50);
  uVar106 = local_1c8._0_4_;
  auVar166._4_4_ = uVar106;
  auVar166._0_4_ = uVar106;
  auVar166._8_4_ = uVar106;
  auVar166._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar48 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar188._0_4_ = auVar48._0_4_ * fVar100;
  auVar188._4_4_ = auVar48._4_4_ * fVar184;
  auVar188._8_4_ = auVar48._8_4_ * fVar199;
  auVar188._12_4_ = auVar48._12_4_ * fVar200;
  auVar39 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar2,auVar39);
  auVar42 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar166);
  local_1d8 = vsubps_avx512vl(_local_268,auVar50);
  uVar106 = local_1d8._0_4_;
  auVar167._4_4_ = uVar106;
  auVar167._0_4_ = uVar106;
  auVar167._8_4_ = uVar106;
  auVar167._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar48 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar201._0_4_ = auVar48._0_4_ * fVar100;
  auVar201._4_4_ = auVar48._4_4_ * fVar184;
  auVar201._8_4_ = auVar48._8_4_ * fVar199;
  auVar201._12_4_ = auVar48._12_4_ * fVar200;
  auVar39 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar2,auVar39);
  auVar43 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar167);
  local_1e8 = vsubps_avx512vl(_local_278,auVar50);
  uVar106 = local_1e8._0_4_;
  auVar168._4_4_ = uVar106;
  auVar168._0_4_ = uVar106;
  auVar168._8_4_ = uVar106;
  auVar168._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar48 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar209._0_4_ = auVar48._0_4_ * fVar100;
  auVar209._4_4_ = auVar48._4_4_ * fVar184;
  auVar209._8_4_ = auVar48._8_4_ * fVar199;
  auVar209._12_4_ = auVar48._12_4_ * fVar200;
  auVar39 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar2,auVar39);
  auVar44 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar168);
  local_1f8 = vsubps_avx512vl(_local_238,auVar50);
  uVar106 = local_1f8._0_4_;
  auVar46._4_4_ = uVar106;
  auVar46._0_4_ = uVar106;
  auVar46._8_4_ = uVar106;
  auVar46._12_4_ = uVar106;
  auVar39 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar48 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar64._0_4_ = auVar48._0_4_ * fVar100;
  auVar64._4_4_ = auVar48._4_4_ * fVar184;
  auVar64._8_4_ = auVar48._8_4_ * fVar199;
  auVar64._12_4_ = auVar48._12_4_ * fVar200;
  auVar39 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar39);
  auVar46 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar1,auVar46);
  auVar3 = vmovlhps_avx(auVar51,auVar42);
  auVar49 = vmovlhps_avx(auVar52,auVar43);
  auVar45 = vmovlhps_avx512f(auVar41,auVar44);
  _local_328 = vmovlhps_avx512f(auVar40,auVar46);
  auVar48 = vminps_avx(auVar3,auVar49);
  auVar39 = vmaxps_avx(auVar3,auVar49);
  auVar50 = vminps_avx512vl(auVar45,_local_328);
  auVar48 = vminps_avx(auVar48,auVar50);
  auVar50 = vmaxps_avx512vl(auVar45,_local_328);
  auVar39 = vmaxps_avx(auVar39,auVar50);
  auVar50 = vshufpd_avx(auVar48,auVar48,3);
  auVar48 = vminps_avx(auVar48,auVar50);
  auVar50 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vmaxps_avx(auVar39,auVar50);
  auVar48 = vandps_avx512vl(auVar48,auVar239._0_16_);
  auVar39 = vandps_avx512vl(auVar39,auVar239._0_16_);
  auVar39 = vmaxps_avx(auVar48,auVar39);
  auVar48 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar48,auVar39);
  local_308 = vmovddup_avx512vl(auVar51);
  local_318 = vmovddup_avx512vl(auVar52);
  auVar107._8_8_ = auVar41._0_8_;
  auVar107._0_8_ = auVar41._0_8_;
  auVar149._0_8_ = auVar40._0_8_;
  auVar149._8_8_ = auVar149._0_8_;
  local_338 = ZEXT416((uint)(auVar39._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_338);
  auVar39 = vxorps_avx512vl(local_78._0_16_,auVar240._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar39);
  uVar31 = 0;
  auVar39 = vsubps_avx(auVar49,auVar3);
  auVar50 = vsubps_avx512vl(auVar45,auVar49);
  local_178 = vsubps_avx512vl(_local_328,auVar45);
  local_288 = vsubps_avx(_local_218,local_208);
  local_298 = vsubps_avx512vl(_local_268,local_248);
  local_2a8 = vsubps_avx512vl(_local_278,local_258);
  _local_2b8 = vsubps_avx512vl(_local_238,local_228);
  local_2c8 = vpbroadcastd_avx512vl();
  local_2d8 = vpbroadcastd_avx512vl();
  auVar48 = ZEXT816(0x3f80000000000000);
  auVar236 = ZEXT1664(auVar48);
  do {
    auVar65 = auVar236._0_16_;
    auVar51 = vshufps_avx(auVar65,auVar65,0x50);
    auVar221._8_4_ = 0x3f800000;
    auVar221._0_8_ = &DAT_3f8000003f800000;
    auVar221._12_4_ = 0x3f800000;
    auVar226._16_4_ = 0x3f800000;
    auVar226._0_16_ = auVar221;
    auVar226._20_4_ = 0x3f800000;
    auVar226._24_4_ = 0x3f800000;
    auVar226._28_4_ = 0x3f800000;
    auVar52 = vsubps_avx(auVar221,auVar51);
    fVar100 = auVar51._0_4_;
    fVar102 = auVar42._0_4_;
    auVar127._0_4_ = fVar102 * fVar100;
    fVar184 = auVar51._4_4_;
    fVar103 = auVar42._4_4_;
    auVar127._4_4_ = fVar103 * fVar184;
    fVar199 = auVar51._8_4_;
    auVar127._8_4_ = fVar102 * fVar199;
    fVar200 = auVar51._12_4_;
    auVar127._12_4_ = fVar103 * fVar200;
    fVar104 = auVar43._0_4_;
    auVar135._0_4_ = fVar104 * fVar100;
    fVar125 = auVar43._4_4_;
    auVar135._4_4_ = fVar125 * fVar184;
    auVar135._8_4_ = fVar104 * fVar199;
    auVar135._12_4_ = fVar125 * fVar200;
    fVar105 = auVar44._0_4_;
    auVar142._0_4_ = fVar105 * fVar100;
    fVar116 = auVar44._4_4_;
    auVar142._4_4_ = fVar116 * fVar184;
    auVar142._8_4_ = fVar105 * fVar199;
    auVar142._12_4_ = fVar116 * fVar200;
    fVar117 = auVar46._0_4_;
    auVar108._0_4_ = fVar117 * fVar100;
    fVar118 = auVar46._4_4_;
    auVar108._4_4_ = fVar118 * fVar184;
    auVar108._8_4_ = fVar117 * fVar199;
    auVar108._12_4_ = fVar118 * fVar200;
    auVar41 = vfmadd231ps_avx512vl(auVar127,auVar52,local_308);
    auVar40 = vfmadd231ps_avx512vl(auVar135,auVar52,local_318);
    auVar47 = vfmadd231ps_avx512vl(auVar142,auVar52,auVar107);
    auVar52 = vfmadd231ps_fma(auVar108,auVar149,auVar52);
    auVar51 = vmovshdup_avx(auVar48);
    fVar184 = auVar48._0_4_;
    fVar100 = (auVar51._0_4_ - fVar184) * 0.04761905;
    auVar163._4_4_ = fVar184;
    auVar163._0_4_ = fVar184;
    auVar163._8_4_ = fVar184;
    auVar163._12_4_ = fVar184;
    auVar163._16_4_ = fVar184;
    auVar163._20_4_ = fVar184;
    auVar163._24_4_ = fVar184;
    auVar163._28_4_ = fVar184;
    auVar122._0_8_ = auVar51._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar74 = vsubps_avx(auVar122,auVar163);
    uVar106 = auVar41._0_4_;
    auVar123._4_4_ = uVar106;
    auVar123._0_4_ = uVar106;
    auVar123._8_4_ = uVar106;
    auVar123._12_4_ = uVar106;
    auVar123._16_4_ = uVar106;
    auVar123._20_4_ = uVar106;
    auVar123._24_4_ = uVar106;
    auVar123._28_4_ = uVar106;
    auVar82 = ZEXT1632(auVar41);
    auVar70 = auVar243._0_32_;
    auVar72 = vpermps_avx512vl(auVar70,auVar82);
    auVar75 = vbroadcastss_avx512vl(auVar40);
    auVar83 = ZEXT1632(auVar40);
    auVar73 = vpermps_avx512vl(auVar70,auVar83);
    auVar76 = vbroadcastss_avx512vl(auVar47);
    auVar68 = ZEXT1632(auVar47);
    auVar77 = vpermps_avx512vl(auVar70,auVar68);
    auVar78 = vbroadcastss_avx512vl(auVar52);
    auVar69 = ZEXT1632(auVar52);
    auVar70 = vpermps_avx512vl(auVar70,auVar69);
    auVar182._4_4_ = fVar100;
    auVar182._0_4_ = fVar100;
    auVar182._8_4_ = fVar100;
    auVar182._12_4_ = fVar100;
    auVar182._16_4_ = fVar100;
    auVar182._20_4_ = fVar100;
    auVar182._24_4_ = fVar100;
    auVar182._28_4_ = fVar100;
    auVar80 = auVar244._0_32_;
    auVar71 = vpermps_avx512vl(auVar80,auVar82);
    auVar153._8_4_ = 3;
    auVar153._0_8_ = 0x300000003;
    auVar153._12_4_ = 3;
    auVar153._16_4_ = 3;
    auVar153._20_4_ = 3;
    auVar153._24_4_ = 3;
    auVar153._28_4_ = 3;
    auVar79 = vpermps_avx512vl(auVar153,auVar82);
    auVar66 = vpermps_avx512vl(auVar80,auVar83);
    auVar82 = vpermps_avx2(auVar153,auVar83);
    auVar67 = vpermps_avx512vl(auVar80,auVar68);
    auVar83 = vpermps_avx2(auVar153,auVar68);
    auVar68 = vpermps_avx512vl(auVar80,auVar69);
    auVar69 = vpermps_avx512vl(auVar153,auVar69);
    auVar51 = vfmadd132ps_fma(auVar74,auVar163,_DAT_02020f20);
    auVar74 = vsubps_avx(auVar226,ZEXT1632(auVar51));
    auVar80 = vmulps_avx512vl(auVar75,ZEXT1632(auVar51));
    auVar84 = ZEXT1632(auVar51);
    auVar81 = vmulps_avx512vl(auVar73,auVar84);
    auVar52 = vfmadd231ps_fma(auVar80,auVar74,auVar123);
    auVar41 = vfmadd231ps_fma(auVar81,auVar74,auVar72);
    auVar80 = vmulps_avx512vl(auVar76,auVar84);
    auVar81 = vmulps_avx512vl(auVar77,auVar84);
    auVar75 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar75);
    auVar73 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar73);
    auVar80 = vmulps_avx512vl(auVar78,auVar84);
    auVar81 = ZEXT1632(auVar51);
    auVar70 = vmulps_avx512vl(auVar70,auVar81);
    auVar76 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar77);
    fVar199 = auVar51._0_4_;
    fVar200 = auVar51._4_4_;
    auVar19._4_4_ = fVar200 * auVar75._4_4_;
    auVar19._0_4_ = fVar199 * auVar75._0_4_;
    fVar207 = auVar51._8_4_;
    auVar19._8_4_ = fVar207 * auVar75._8_4_;
    fVar216 = auVar51._12_4_;
    auVar19._12_4_ = fVar216 * auVar75._12_4_;
    auVar19._16_4_ = auVar75._16_4_ * 0.0;
    auVar19._20_4_ = auVar75._20_4_ * 0.0;
    auVar19._24_4_ = auVar75._24_4_ * 0.0;
    auVar19._28_4_ = fVar184;
    auVar20._4_4_ = fVar200 * auVar73._4_4_;
    auVar20._0_4_ = fVar199 * auVar73._0_4_;
    auVar20._8_4_ = fVar207 * auVar73._8_4_;
    auVar20._12_4_ = fVar216 * auVar73._12_4_;
    auVar20._16_4_ = auVar73._16_4_ * 0.0;
    auVar20._20_4_ = auVar73._20_4_ * 0.0;
    auVar20._24_4_ = auVar73._24_4_ * 0.0;
    auVar20._28_4_ = auVar72._28_4_;
    auVar52 = vfmadd231ps_fma(auVar19,auVar74,ZEXT1632(auVar52));
    auVar41 = vfmadd231ps_fma(auVar20,auVar74,ZEXT1632(auVar41));
    auVar114._0_4_ = fVar199 * auVar76._0_4_;
    auVar114._4_4_ = fVar200 * auVar76._4_4_;
    auVar114._8_4_ = fVar207 * auVar76._8_4_;
    auVar114._12_4_ = fVar216 * auVar76._12_4_;
    auVar114._16_4_ = auVar76._16_4_ * 0.0;
    auVar114._20_4_ = auVar76._20_4_ * 0.0;
    auVar114._24_4_ = auVar76._24_4_ * 0.0;
    auVar114._28_4_ = 0;
    auVar21._4_4_ = fVar200 * auVar77._4_4_;
    auVar21._0_4_ = fVar199 * auVar77._0_4_;
    auVar21._8_4_ = fVar207 * auVar77._8_4_;
    auVar21._12_4_ = fVar216 * auVar77._12_4_;
    auVar21._16_4_ = auVar77._16_4_ * 0.0;
    auVar21._20_4_ = auVar77._20_4_ * 0.0;
    auVar21._24_4_ = auVar77._24_4_ * 0.0;
    auVar21._28_4_ = auVar76._28_4_;
    auVar40 = vfmadd231ps_fma(auVar114,auVar74,auVar75);
    auVar47 = vfmadd231ps_fma(auVar21,auVar74,auVar73);
    auVar22._28_4_ = auVar73._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * auVar47._12_4_,
                            CONCAT48(fVar207 * auVar47._8_4_,
                                     CONCAT44(fVar200 * auVar47._4_4_,fVar199 * auVar47._0_4_))));
    auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar216 * auVar40._12_4_,
                                                 CONCAT48(fVar207 * auVar40._8_4_,
                                                          CONCAT44(fVar200 * auVar40._4_4_,
                                                                   fVar199 * auVar40._0_4_)))),
                              auVar74,ZEXT1632(auVar52));
    auVar53 = vfmadd231ps_fma(auVar22,auVar74,ZEXT1632(auVar41));
    auVar72 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar52));
    auVar75 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar41));
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar72 = vmulps_avx512vl(auVar72,auVar73);
    auVar75 = vmulps_avx512vl(auVar75,auVar73);
    auVar175._0_4_ = fVar100 * auVar72._0_4_;
    auVar175._4_4_ = fVar100 * auVar72._4_4_;
    auVar175._8_4_ = fVar100 * auVar72._8_4_;
    auVar175._12_4_ = fVar100 * auVar72._12_4_;
    auVar175._16_4_ = fVar100 * auVar72._16_4_;
    auVar175._20_4_ = fVar100 * auVar72._20_4_;
    auVar175._24_4_ = fVar100 * auVar72._24_4_;
    auVar175._28_4_ = 0;
    auVar72 = vmulps_avx512vl(auVar182,auVar75);
    auVar40 = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar53),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar115._0_4_ = auVar175._0_4_ + auVar55._0_4_;
    auVar115._4_4_ = auVar175._4_4_ + auVar55._4_4_;
    auVar115._8_4_ = auVar175._8_4_ + auVar55._8_4_;
    auVar115._12_4_ = auVar175._12_4_ + auVar55._12_4_;
    auVar115._16_4_ = auVar175._16_4_ + 0.0;
    auVar115._20_4_ = auVar175._20_4_ + 0.0;
    auVar115._24_4_ = auVar175._24_4_ + 0.0;
    auVar115._28_4_ = 0;
    auVar84 = ZEXT1632(auVar40);
    auVar77 = vpermt2ps_avx512vl(auVar175,_DAT_0205fd20,auVar84);
    auVar78 = vaddps_avx512vl(ZEXT1632(auVar53),auVar72);
    auVar70 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,auVar84);
    auVar72 = vsubps_avx(auVar75,auVar77);
    auVar77 = vsubps_avx512vl(auVar76,auVar70);
    auVar70 = vmulps_avx512vl(auVar66,auVar81);
    auVar80 = vmulps_avx512vl(auVar82,auVar81);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar74,auVar71);
    auVar71 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar79);
    auVar79 = vmulps_avx512vl(auVar67,auVar81);
    auVar80 = vmulps_avx512vl(auVar83,auVar81);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar66);
    auVar82 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar82);
    auVar66 = vmulps_avx512vl(auVar68,auVar81);
    auVar68 = vmulps_avx512vl(auVar69,auVar81);
    auVar52 = vfmadd231ps_fma(auVar66,auVar74,auVar67);
    auVar41 = vfmadd231ps_fma(auVar68,auVar74,auVar83);
    auVar66 = vmulps_avx512vl(auVar81,auVar79);
    auVar68 = vmulps_avx512vl(ZEXT1632(auVar51),auVar82);
    auVar70 = vfmadd231ps_avx512vl(auVar66,auVar74,auVar70);
    auVar71 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar71);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar52._12_4_,
                                            CONCAT48(fVar207 * auVar52._8_4_,
                                                     CONCAT44(fVar200 * auVar52._4_4_,
                                                              fVar199 * auVar52._0_4_)))),auVar74,
                         auVar79);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar41._12_4_,
                                            CONCAT48(fVar207 * auVar41._8_4_,
                                                     CONCAT44(fVar200 * auVar41._4_4_,
                                                              fVar199 * auVar41._0_4_)))),auVar74,
                         auVar82);
    auVar23._4_4_ = fVar200 * auVar79._4_4_;
    auVar23._0_4_ = fVar199 * auVar79._0_4_;
    auVar23._8_4_ = fVar207 * auVar79._8_4_;
    auVar23._12_4_ = fVar216 * auVar79._12_4_;
    auVar23._16_4_ = auVar79._16_4_ * 0.0;
    auVar23._20_4_ = auVar79._20_4_ * 0.0;
    auVar23._24_4_ = auVar79._24_4_ * 0.0;
    auVar23._28_4_ = auVar83._28_4_;
    auVar24._4_4_ = fVar200 * auVar82._4_4_;
    auVar24._0_4_ = fVar199 * auVar82._0_4_;
    auVar24._8_4_ = fVar207 * auVar82._8_4_;
    auVar24._12_4_ = fVar216 * auVar82._12_4_;
    auVar24._16_4_ = auVar82._16_4_ * 0.0;
    auVar24._20_4_ = auVar82._20_4_ * 0.0;
    auVar24._24_4_ = auVar82._24_4_ * 0.0;
    auVar24._28_4_ = auVar67._28_4_;
    auVar83 = vfmadd231ps_avx512vl(auVar23,auVar74,auVar70);
    auVar66 = vfmadd231ps_avx512vl(auVar24,auVar71,auVar74);
    auVar74 = vsubps_avx512vl(auVar79,auVar70);
    auVar82 = vsubps_avx512vl(auVar82,auVar71);
    auVar74 = vmulps_avx512vl(auVar74,auVar73);
    auVar82 = vmulps_avx512vl(auVar82,auVar73);
    fVar184 = fVar100 * auVar74._0_4_;
    fVar199 = fVar100 * auVar74._4_4_;
    auVar25._4_4_ = fVar199;
    auVar25._0_4_ = fVar184;
    fVar200 = fVar100 * auVar74._8_4_;
    auVar25._8_4_ = fVar200;
    fVar207 = fVar100 * auVar74._12_4_;
    auVar25._12_4_ = fVar207;
    fVar216 = fVar100 * auVar74._16_4_;
    auVar25._16_4_ = fVar216;
    fVar217 = fVar100 * auVar74._20_4_;
    auVar25._20_4_ = fVar217;
    fVar100 = fVar100 * auVar74._24_4_;
    auVar25._24_4_ = fVar100;
    auVar25._28_4_ = auVar74._28_4_;
    auVar82 = vmulps_avx512vl(auVar182,auVar82);
    auVar73 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,auVar84);
    auVar70 = vpermt2ps_avx512vl(auVar66,_DAT_0205fd20,auVar84);
    auVar183._0_4_ = auVar83._0_4_ + fVar184;
    auVar183._4_4_ = auVar83._4_4_ + fVar199;
    auVar183._8_4_ = auVar83._8_4_ + fVar200;
    auVar183._12_4_ = auVar83._12_4_ + fVar207;
    auVar183._16_4_ = auVar83._16_4_ + fVar216;
    auVar183._20_4_ = auVar83._20_4_ + fVar217;
    auVar183._24_4_ = auVar83._24_4_ + fVar100;
    auVar183._28_4_ = auVar83._28_4_ + auVar74._28_4_;
    auVar74 = vpermt2ps_avx512vl(auVar25,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar71 = vaddps_avx512vl(auVar66,auVar82);
    auVar82 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar74 = vsubps_avx(auVar73,auVar74);
    auVar82 = vsubps_avx512vl(auVar70,auVar82);
    auVar132 = ZEXT1632(auVar55);
    auVar79 = vsubps_avx512vl(auVar83,auVar132);
    auVar140 = ZEXT1632(auVar53);
    auVar67 = vsubps_avx512vl(auVar66,auVar140);
    auVar68 = vsubps_avx512vl(auVar73,auVar75);
    auVar79 = vaddps_avx512vl(auVar79,auVar68);
    auVar68 = vsubps_avx512vl(auVar70,auVar76);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar140,auVar79);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar132,auVar67);
    auVar69 = vmulps_avx512vl(auVar78,auVar79);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar115,auVar67);
    auVar80 = vmulps_avx512vl(auVar77,auVar79);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar72,auVar67);
    auVar81 = vmulps_avx512vl(auVar76,auVar79);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar75,auVar67);
    auVar84 = vmulps_avx512vl(auVar66,auVar79);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar83,auVar67);
    auVar85 = vmulps_avx512vl(auVar71,auVar79);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar183,auVar67);
    auVar86 = vmulps_avx512vl(auVar82,auVar79);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar74,auVar67);
    auVar79 = vmulps_avx512vl(auVar70,auVar79);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar73,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar69);
    auVar68 = vmaxps_avx512vl(auVar68,auVar69);
    auVar69 = vminps_avx512vl(auVar80,auVar81);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar69 = vmaxps_avx512vl(auVar80,auVar81);
    auVar68 = vmaxps_avx512vl(auVar68,auVar69);
    auVar69 = vminps_avx512vl(auVar84,auVar85);
    auVar80 = vmaxps_avx512vl(auVar84,auVar85);
    auVar81 = vminps_avx512vl(auVar86,auVar79);
    auVar69 = vminps_avx512vl(auVar69,auVar81);
    auVar67 = vminps_avx512vl(auVar67,auVar69);
    auVar79 = vmaxps_avx512vl(auVar86,auVar79);
    auVar79 = vmaxps_avx512vl(auVar80,auVar79);
    auVar79 = vmaxps_avx512vl(auVar68,auVar79);
    uVar15 = vcmpps_avx512vl(auVar67,local_78,2);
    uVar16 = vcmpps_avx512vl(auVar79,local_98,5);
    uVar33 = 0;
    bVar29 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar29 != 0) {
      auVar79 = vsubps_avx512vl(auVar75,auVar132);
      auVar67 = vsubps_avx512vl(auVar76,auVar140);
      auVar68 = vsubps_avx512vl(auVar73,auVar83);
      auVar79 = vaddps_avx512vl(auVar79,auVar68);
      auVar68 = vsubps_avx512vl(auVar70,auVar66);
      auVar67 = vaddps_avx512vl(auVar67,auVar68);
      auVar68 = vmulps_avx512vl(auVar140,auVar79);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar132);
      auVar78 = vmulps_avx512vl(auVar78,auVar79);
      auVar78 = vfnmadd213ps_avx512vl(auVar115,auVar67,auVar78);
      auVar77 = vmulps_avx512vl(auVar77,auVar79);
      auVar77 = vfnmadd213ps_avx512vl(auVar72,auVar67,auVar77);
      auVar72 = vmulps_avx512vl(auVar76,auVar79);
      auVar76 = vfnmadd231ps_avx512vl(auVar72,auVar67,auVar75);
      auVar72 = vmulps_avx512vl(auVar66,auVar79);
      auVar83 = vfnmadd231ps_avx512vl(auVar72,auVar67,auVar83);
      auVar72 = vmulps_avx512vl(auVar71,auVar79);
      auVar71 = vfnmadd213ps_avx512vl(auVar183,auVar67,auVar72);
      auVar72 = vmulps_avx512vl(auVar82,auVar79);
      auVar66 = vfnmadd213ps_avx512vl(auVar74,auVar67,auVar72);
      auVar74 = vmulps_avx512vl(auVar70,auVar79);
      auVar73 = vfnmadd231ps_avx512vl(auVar74,auVar73,auVar67);
      auVar72 = vminps_avx(auVar68,auVar78);
      auVar74 = vmaxps_avx(auVar68,auVar78);
      auVar75 = vminps_avx(auVar77,auVar76);
      auVar75 = vminps_avx(auVar72,auVar75);
      auVar72 = vmaxps_avx(auVar77,auVar76);
      auVar74 = vmaxps_avx(auVar74,auVar72);
      auVar82 = vminps_avx(auVar83,auVar71);
      auVar72 = vmaxps_avx(auVar83,auVar71);
      auVar83 = vminps_avx(auVar66,auVar73);
      auVar82 = vminps_avx(auVar82,auVar83);
      auVar82 = vminps_avx(auVar75,auVar82);
      auVar75 = vmaxps_avx(auVar66,auVar73);
      auVar72 = vmaxps_avx(auVar72,auVar75);
      auVar74 = vmaxps_avx(auVar74,auVar72);
      uVar15 = vcmpps_avx512vl(auVar74,local_98,5);
      uVar16 = vcmpps_avx512vl(auVar82,local_78,2);
      uVar33 = (uint)(bVar29 & (byte)uVar15 & (byte)uVar16);
    }
    if (uVar33 != 0) {
      auStack_2f8[uVar31] = uVar33;
      uVar15 = vmovlps_avx(auVar48);
      *(undefined8 *)(&uStack_168 + uVar31 * 2) = uVar15;
      uVar38 = vmovlps_avx512f(auVar65);
      auStack_58[uVar31] = uVar38;
      uVar31 = (ulong)((int)uVar31 + 1);
    }
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar239 = ZEXT1664(auVar48);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar240 = ZEXT1664(auVar48);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar238 = ZEXT3264(auVar74);
    auVar241 = ZEXT464(0x3f800000);
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar242 = ZEXT1664(auVar48);
    do {
      auVar48 = auVar242._0_16_;
      if ((int)uVar31 == 0) {
        uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar18._4_4_ = uVar106;
        auVar18._0_4_ = uVar106;
        auVar18._8_4_ = uVar106;
        auVar18._12_4_ = uVar106;
        auVar18._16_4_ = uVar106;
        auVar18._20_4_ = uVar106;
        auVar18._24_4_ = uVar106;
        auVar18._28_4_ = uVar106;
        uVar15 = vcmpps_avx512vl(local_b8,auVar18,2);
        uVar36 = (uint)uVar37 & (uint)uVar37 + 0xff & (uint)uVar15;
        uVar37 = (ulong)uVar36;
        if (uVar36 == 0) {
          return;
        }
        goto LAB_01d97f74;
      }
      uVar30 = (int)uVar31 - 1;
      uVar32 = (ulong)uVar30;
      uVar33 = (&uStack_168)[uVar32 * 2];
      fVar100 = afStack_164[uVar32 * 2];
      uVar6 = auStack_2f8[uVar32];
      auVar235._8_8_ = 0;
      auVar235._0_8_ = auStack_58[uVar32];
      auVar236 = ZEXT1664(auVar235);
      lVar35 = 0;
      for (uVar38 = (ulong)uVar6; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar35 = lVar35 + 1;
      }
      uVar34 = uVar6 - 1 & uVar6;
      auStack_2f8[uVar32] = uVar34;
      if (uVar34 == 0) {
        uVar31 = (ulong)uVar30;
      }
      auVar119._0_4_ = (float)lVar35;
      auVar119._4_8_ = SUB128(ZEXT812(0),4);
      auVar119._12_4_ = 0;
      auVar51 = vmulss_avx512f(auVar119,SUB6416(ZEXT464(0x3e124925),0));
      lVar35 = lVar35 + 1;
      auVar52 = vmulss_avx512f(ZEXT416((uint)(float)lVar35),SUB6416(ZEXT464(0x3e124925),0));
      auVar40 = auVar241._0_16_;
      auVar41 = vsubss_avx512f(auVar40,auVar51);
      auVar51 = vmulss_avx512f(ZEXT416((uint)fVar100),auVar51);
      auVar41 = vfmadd231ss_avx512f(auVar51,ZEXT416(uVar33),auVar41);
      auVar51 = vsubss_avx512f(auVar40,auVar52);
      auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * auVar52._0_4_)),ZEXT416(uVar33),auVar51);
      auVar52 = vsubss_avx512f(auVar51,auVar41);
      vucomiss_avx512f(auVar52);
      if (uVar6 == 0 || lVar35 == 0) break;
      auVar47 = vshufps_avx(auVar235,auVar235,0x50);
      vucomiss_avx512f(auVar52);
      auVar53 = vsubps_avx512vl(auVar48,auVar47);
      fVar100 = auVar47._0_4_;
      auVar128._0_4_ = fVar102 * fVar100;
      fVar184 = auVar47._4_4_;
      auVar128._4_4_ = fVar103 * fVar184;
      fVar199 = auVar47._8_4_;
      auVar128._8_4_ = fVar102 * fVar199;
      fVar200 = auVar47._12_4_;
      auVar128._12_4_ = fVar103 * fVar200;
      auVar136._0_4_ = fVar104 * fVar100;
      auVar136._4_4_ = fVar125 * fVar184;
      auVar136._8_4_ = fVar104 * fVar199;
      auVar136._12_4_ = fVar125 * fVar200;
      auVar143._0_4_ = fVar105 * fVar100;
      auVar143._4_4_ = fVar116 * fVar184;
      auVar143._8_4_ = fVar105 * fVar199;
      auVar143._12_4_ = fVar116 * fVar200;
      auVar109._0_4_ = fVar117 * fVar100;
      auVar109._4_4_ = fVar118 * fVar184;
      auVar109._8_4_ = fVar117 * fVar199;
      auVar109._12_4_ = fVar118 * fVar200;
      auVar47 = vfmadd231ps_fma(auVar128,auVar53,local_308);
      auVar55 = vfmadd231ps_fma(auVar136,auVar53,local_318);
      auVar54 = vfmadd231ps_avx512vl(auVar143,auVar53,auVar107);
      auVar53 = vfmadd231ps_fma(auVar109,auVar149,auVar53);
      auVar124._16_16_ = auVar47;
      auVar124._0_16_ = auVar47;
      auVar133._16_16_ = auVar55;
      auVar133._0_16_ = auVar55;
      auVar141._16_16_ = auVar54;
      auVar141._0_16_ = auVar54;
      uVar106 = auVar41._0_4_;
      auVar154._4_4_ = uVar106;
      auVar154._0_4_ = uVar106;
      auVar154._8_4_ = uVar106;
      auVar154._12_4_ = uVar106;
      uVar106 = auVar51._0_4_;
      auVar154._20_4_ = uVar106;
      auVar154._16_4_ = uVar106;
      auVar154._24_4_ = uVar106;
      auVar154._28_4_ = uVar106;
      auVar74 = vsubps_avx(auVar133,auVar124);
      auVar55 = vfmadd213ps_fma(auVar74,auVar154,auVar124);
      auVar74 = vsubps_avx(auVar141,auVar133);
      auVar65 = vfmadd213ps_fma(auVar74,auVar154,auVar133);
      auVar47 = vsubps_avx(auVar53,auVar54);
      auVar134._16_16_ = auVar47;
      auVar134._0_16_ = auVar47;
      auVar47 = vfmadd213ps_fma(auVar134,auVar154,auVar141);
      auVar74 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar55));
      auVar55 = vfmadd213ps_fma(auVar74,auVar154,ZEXT1632(auVar55));
      auVar74 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar65));
      auVar47 = vfmadd213ps_fma(auVar74,auVar154,ZEXT1632(auVar65));
      auVar74 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar55));
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar74,auVar154);
      auVar74 = vmulps_avx512vl(auVar74,auVar238._0_32_);
      auVar88._16_16_ = auVar74._16_16_;
      fVar100 = auVar52._0_4_ * 0.33333334;
      auVar144._0_8_ =
           CONCAT44(auVar60._4_4_ + fVar100 * auVar74._4_4_,auVar60._0_4_ + fVar100 * auVar74._0_4_)
      ;
      auVar144._8_4_ = auVar60._8_4_ + fVar100 * auVar74._8_4_;
      auVar144._12_4_ = auVar60._12_4_ + fVar100 * auVar74._12_4_;
      auVar129._0_4_ = fVar100 * auVar74._16_4_;
      auVar129._4_4_ = fVar100 * auVar74._20_4_;
      auVar129._8_4_ = fVar100 * auVar74._24_4_;
      auVar129._12_4_ = fVar100 * auVar74._28_4_;
      auVar148 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar63 = vshufpd_avx(auVar60,auVar60,3);
      auVar61 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar47 = vsubps_avx(auVar63,auVar60);
      auVar55 = vsubps_avx(auVar61,(undefined1  [16])0x0);
      auVar155._0_4_ = auVar55._0_4_ + auVar47._0_4_;
      auVar155._4_4_ = auVar55._4_4_ + auVar47._4_4_;
      auVar155._8_4_ = auVar55._8_4_ + auVar47._8_4_;
      auVar155._12_4_ = auVar55._12_4_ + auVar47._12_4_;
      auVar47 = vshufps_avx(auVar60,auVar60,0xb1);
      auVar55 = vshufps_avx(auVar144,auVar144,0xb1);
      auVar53 = vshufps_avx(auVar148,auVar148,0xb1);
      auVar65 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar210._4_4_ = auVar155._0_4_;
      auVar210._0_4_ = auVar155._0_4_;
      auVar210._8_4_ = auVar155._0_4_;
      auVar210._12_4_ = auVar155._0_4_;
      auVar54 = vshufps_avx(auVar155,auVar155,0x55);
      fVar100 = auVar54._0_4_;
      auVar169._0_4_ = auVar47._0_4_ * fVar100;
      fVar184 = auVar54._4_4_;
      auVar169._4_4_ = auVar47._4_4_ * fVar184;
      fVar199 = auVar54._8_4_;
      auVar169._8_4_ = auVar47._8_4_ * fVar199;
      fVar200 = auVar54._12_4_;
      auVar169._12_4_ = auVar47._12_4_ * fVar200;
      auVar179._0_4_ = auVar55._0_4_ * fVar100;
      auVar179._4_4_ = auVar55._4_4_ * fVar184;
      auVar179._8_4_ = auVar55._8_4_ * fVar199;
      auVar179._12_4_ = auVar55._12_4_ * fVar200;
      auVar189._0_4_ = auVar53._0_4_ * fVar100;
      auVar189._4_4_ = auVar53._4_4_ * fVar184;
      auVar189._8_4_ = auVar53._8_4_ * fVar199;
      auVar189._12_4_ = auVar53._12_4_ * fVar200;
      auVar156._0_4_ = auVar65._0_4_ * fVar100;
      auVar156._4_4_ = auVar65._4_4_ * fVar184;
      auVar156._8_4_ = auVar65._8_4_ * fVar199;
      auVar156._12_4_ = auVar65._12_4_ * fVar200;
      auVar47 = vfmadd231ps_fma(auVar169,auVar210,auVar60);
      auVar55 = vfmadd231ps_fma(auVar179,auVar210,auVar144);
      auVar54 = vfmadd231ps_fma(auVar189,auVar210,auVar148);
      auVar59 = vfmadd231ps_fma(auVar156,(undefined1  [16])0x0,auVar210);
      auVar62 = vshufpd_avx(auVar47,auVar47,1);
      auVar56 = vshufpd_avx(auVar55,auVar55,1);
      auVar57 = vshufpd_avx(auVar54,auVar54,1);
      auVar58 = vshufpd_avx(auVar59,auVar59,1);
      auVar53 = vminss_avx(auVar47,auVar55);
      auVar47 = vmaxss_avx(auVar55,auVar47);
      auVar65 = vminss_avx(auVar54,auVar59);
      auVar55 = vmaxss_avx(auVar59,auVar54);
      auVar65 = vminss_avx(auVar53,auVar65);
      auVar47 = vmaxss_avx(auVar55,auVar47);
      auVar54 = vminss_avx(auVar62,auVar56);
      auVar55 = vmaxss_avx(auVar56,auVar62);
      auVar62 = vminss_avx(auVar57,auVar58);
      auVar53 = vmaxss_avx(auVar58,auVar57);
      auVar54 = vminss_avx(auVar54,auVar62);
      auVar55 = vmaxss_avx(auVar53,auVar55);
      fVar199 = auVar65._0_4_;
      fVar184 = auVar55._0_4_;
      fVar100 = auVar47._0_4_;
      if ((0.0001 <= fVar199) || (fVar184 <= -0.0001)) {
        uVar15 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar16 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar100 & ((byte)uVar16 | (byte)uVar15)) != 0) goto LAB_01d98e51;
        uVar15 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar55,5);
        uVar16 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar16 | (ushort)uVar15) & 1) == 0) goto LAB_01d98e51;
LAB_01d99893:
        bVar13 = true;
        auVar236 = ZEXT1664(auVar235);
      }
      else {
LAB_01d98e51:
        auVar56 = auVar246._0_16_;
        uVar15 = vcmpss_avx512f(auVar65,auVar56,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        iVar99 = auVar241._0_4_;
        fVar200 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        uVar15 = vcmpss_avx512f(auVar47,auVar56,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        fVar207 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        bVar13 = fVar200 != fVar207;
        iVar245 = auVar246._0_4_;
        auVar88._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar87._4_28_ = auVar88._4_28_;
        auVar87._0_4_ = (uint)bVar13 * iVar245 + (uint)!bVar13 * 0x7f800000;
        auVar62 = auVar87._0_16_;
        auVar90._16_16_ = auVar88._16_16_;
        auVar90._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar13 * iVar245 + (uint)!bVar13 * -0x800000;
        auVar53 = auVar89._0_16_;
        uVar15 = vcmpss_avx512f(auVar54,auVar56,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        fVar216 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        if ((fVar200 != fVar216) || (NAN(fVar200) || NAN(fVar216))) {
          fVar200 = auVar54._0_4_;
          bVar13 = fVar200 == fVar199;
          if ((!bVar13) || (NAN(fVar200) || NAN(fVar199))) {
            auVar65 = vxorps_avx512vl(auVar65,auVar240._0_16_);
            auVar230._0_4_ = auVar65._0_4_ / (fVar200 - fVar199);
            auVar230._4_12_ = auVar65._4_12_;
            auVar65 = vsubss_avx512f(auVar40,auVar230);
            auVar54 = vfmadd213ss_avx512f(auVar65,auVar56,auVar230);
            auVar65 = auVar54;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar92._16_16_ = auVar88._16_16_;
            auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar91._4_28_ = auVar92._4_28_;
            auVar91._0_4_ = (uint)bVar13 * iVar245 + (uint)!bVar13 * 0x7f800000;
            auVar54 = auVar91._0_16_;
            auVar65 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar62 = vminss_avx(auVar62,auVar54);
          auVar53 = vmaxss_avx(auVar65,auVar53);
        }
        uVar15 = vcmpss_avx512f(auVar55,auVar56,1);
        bVar13 = (bool)((byte)uVar15 & 1);
        fVar199 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar99);
        if ((fVar207 != fVar199) || (NAN(fVar207) || NAN(fVar199))) {
          bVar13 = fVar184 == fVar100;
          if ((!bVar13) || (NAN(fVar184) || NAN(fVar100))) {
            auVar47 = vxorps_avx512vl(auVar47,auVar240._0_16_);
            auVar190._0_4_ = auVar47._0_4_ / (fVar184 - fVar100);
            auVar190._4_12_ = auVar47._4_12_;
            auVar47 = vsubss_avx512f(auVar40,auVar190);
            auVar55 = vfmadd213ss_avx512f(auVar47,auVar56,auVar190);
            auVar47 = auVar55;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar94._16_16_ = auVar88._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar13 * iVar245 + (uint)!bVar13 * 0x7f800000;
            auVar55 = auVar93._0_16_;
            auVar47 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar62 = vminss_avx(auVar62,auVar55);
          auVar53 = vmaxss_avx(auVar47,auVar53);
        }
        bVar13 = fVar216 != fVar199;
        auVar47 = vminss_avx512f(auVar62,auVar40);
        auVar96._16_16_ = auVar88._16_16_;
        auVar96._0_16_ = auVar62;
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar13 * auVar47._0_4_ + (uint)!bVar13 * auVar62._0_4_;
        auVar47 = vmaxss_avx512f(auVar40,auVar53);
        auVar98._16_16_ = auVar88._16_16_;
        auVar98._0_16_ = auVar53;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar13 * auVar47._0_4_ + (uint)!bVar13 * auVar53._0_4_;
        auVar47 = vmaxss_avx512f(auVar56,auVar95._0_16_);
        auVar55 = vminss_avx512f(auVar97._0_16_,auVar40);
        bVar13 = true;
        if (auVar55._0_4_ < auVar47._0_4_) goto LAB_01d99893;
        auVar56 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
        auVar57 = vminss_avx512f(ZEXT416((uint)(auVar55._0_4_ + 0.1)),auVar40);
        auVar110._0_8_ = auVar60._0_8_;
        auVar110._8_8_ = auVar110._0_8_;
        auVar180._8_8_ = auVar144._0_8_;
        auVar180._0_8_ = auVar144._0_8_;
        auVar191._8_8_ = auVar148._0_8_;
        auVar191._0_8_ = auVar148._0_8_;
        auVar47 = vshufpd_avx(auVar144,auVar144,3);
        auVar55 = vshufpd_avx(auVar148,auVar148,3);
        auVar53 = vshufps_avx(auVar56,auVar57,0);
        auVar58 = vsubps_avx512vl(auVar48,auVar53);
        fVar100 = auVar53._0_4_;
        auVar222._0_4_ = fVar100 * auVar63._0_4_;
        fVar184 = auVar53._4_4_;
        auVar222._4_4_ = fVar184 * auVar63._4_4_;
        fVar199 = auVar53._8_4_;
        auVar222._8_4_ = fVar199 * auVar63._8_4_;
        fVar200 = auVar53._12_4_;
        auVar222._12_4_ = fVar200 * auVar63._12_4_;
        auVar145._0_4_ = fVar100 * auVar47._0_4_;
        auVar145._4_4_ = fVar184 * auVar47._4_4_;
        auVar145._8_4_ = fVar199 * auVar47._8_4_;
        auVar145._12_4_ = fVar200 * auVar47._12_4_;
        auVar150._0_4_ = fVar100 * auVar55._0_4_;
        auVar150._4_4_ = fVar184 * auVar55._4_4_;
        auVar150._8_4_ = fVar199 * auVar55._8_4_;
        auVar150._12_4_ = fVar200 * auVar55._12_4_;
        auVar130._0_4_ = fVar100 * auVar61._0_4_;
        auVar130._4_4_ = fVar184 * auVar61._4_4_;
        auVar130._8_4_ = fVar199 * auVar61._8_4_;
        auVar130._12_4_ = fVar200 * auVar61._12_4_;
        auVar65 = vfmadd231ps_fma(auVar222,auVar58,auVar110);
        auVar54 = vfmadd231ps_fma(auVar145,auVar58,auVar180);
        auVar62 = vfmadd231ps_fma(auVar150,auVar58,auVar191);
        auVar63 = vfmadd231ps_fma(auVar130,auVar58,ZEXT816(0));
        auVar47 = vsubss_avx512f(auVar40,auVar56);
        auVar55 = vmovshdup_avx512vl(auVar235);
        auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar56._0_4_)),auVar235,
                                      auVar47);
        auVar47 = vsubss_avx512f(auVar40,auVar57);
        auVar60 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar55._0_4_)),auVar235,
                                      auVar47);
        auVar61 = vdivss_avx512f(auVar40,auVar52);
        auVar52 = vsubps_avx(auVar54,auVar65);
        auVar164 = auVar237._0_16_;
        auVar55 = vmulps_avx512vl(auVar52,auVar164);
        auVar52 = vsubps_avx(auVar62,auVar54);
        auVar53 = vmulps_avx512vl(auVar52,auVar164);
        auVar52 = vsubps_avx(auVar63,auVar62);
        auVar52 = vmulps_avx512vl(auVar52,auVar164);
        auVar47 = vminps_avx(auVar53,auVar52);
        auVar52 = vmaxps_avx(auVar53,auVar52);
        auVar47 = vminps_avx(auVar55,auVar47);
        auVar52 = vmaxps_avx(auVar55,auVar52);
        auVar55 = vshufpd_avx(auVar47,auVar47,3);
        auVar53 = vshufpd_avx(auVar52,auVar52,3);
        auVar47 = vminps_avx(auVar47,auVar55);
        auVar52 = vmaxps_avx(auVar52,auVar53);
        fVar100 = auVar61._0_4_;
        auVar170._0_4_ = fVar100 * auVar47._0_4_;
        auVar170._4_4_ = fVar100 * auVar47._4_4_;
        auVar170._8_4_ = fVar100 * auVar47._8_4_;
        auVar170._12_4_ = fVar100 * auVar47._12_4_;
        auVar157._0_4_ = fVar100 * auVar52._0_4_;
        auVar157._4_4_ = fVar100 * auVar52._4_4_;
        auVar157._8_4_ = fVar100 * auVar52._8_4_;
        auVar157._12_4_ = fVar100 * auVar52._12_4_;
        auVar61 = vdivss_avx512f(auVar40,ZEXT416((uint)(auVar60._0_4_ - auVar59._0_4_)));
        auVar52 = vshufpd_avx(auVar65,auVar65,3);
        auVar47 = vshufpd_avx(auVar54,auVar54,3);
        auVar55 = vshufpd_avx(auVar62,auVar62,3);
        auVar53 = vshufpd_avx(auVar63,auVar63,3);
        auVar52 = vsubps_avx(auVar52,auVar65);
        auVar65 = vsubps_avx(auVar47,auVar54);
        auVar54 = vsubps_avx(auVar55,auVar62);
        auVar53 = vsubps_avx(auVar53,auVar63);
        auVar47 = vminps_avx(auVar52,auVar65);
        auVar52 = vmaxps_avx(auVar52,auVar65);
        auVar55 = vminps_avx(auVar54,auVar53);
        auVar55 = vminps_avx(auVar47,auVar55);
        auVar47 = vmaxps_avx(auVar54,auVar53);
        auVar52 = vmaxps_avx(auVar52,auVar47);
        fVar100 = auVar61._0_4_;
        auVar192._0_4_ = fVar100 * auVar55._0_4_;
        auVar192._4_4_ = fVar100 * auVar55._4_4_;
        auVar192._8_4_ = fVar100 * auVar55._8_4_;
        auVar192._12_4_ = fVar100 * auVar55._12_4_;
        auVar202._0_4_ = fVar100 * auVar52._0_4_;
        auVar202._4_4_ = fVar100 * auVar52._4_4_;
        auVar202._8_4_ = fVar100 * auVar52._8_4_;
        auVar202._12_4_ = fVar100 * auVar52._12_4_;
        auVar148 = vinsertps_avx512f(auVar41,auVar59,0x10);
        auVar65 = vinsertps_avx(auVar51,auVar60,0x10);
        auVar101._0_4_ = auVar148._0_4_ + auVar65._0_4_;
        auVar101._4_4_ = auVar148._4_4_ + auVar65._4_4_;
        auVar101._8_4_ = auVar148._8_4_ + auVar65._8_4_;
        auVar101._12_4_ = auVar148._12_4_ + auVar65._12_4_;
        auVar17._8_4_ = 0x3f000000;
        auVar17._0_8_ = 0x3f0000003f000000;
        auVar17._12_4_ = 0x3f000000;
        auVar57 = vmulps_avx512vl(auVar101,auVar17);
        auVar55 = vshufps_avx(auVar57,auVar57,0x54);
        uVar106 = auVar57._0_4_;
        auVar120._4_4_ = uVar106;
        auVar120._0_4_ = uVar106;
        auVar120._8_4_ = uVar106;
        auVar120._12_4_ = uVar106;
        auVar47 = vfmadd213ps_fma(auVar39,auVar120,auVar3);
        auVar54 = vfmadd213ps_avx512vl(auVar50,auVar120,auVar49);
        auVar53 = vfmadd213ps_fma(local_178,auVar120,auVar45);
        auVar52 = vsubps_avx(auVar54,auVar47);
        auVar47 = vfmadd213ps_fma(auVar52,auVar120,auVar47);
        auVar52 = vsubps_avx(auVar53,auVar54);
        auVar52 = vfmadd213ps_fma(auVar52,auVar120,auVar54);
        auVar52 = vsubps_avx(auVar52,auVar47);
        auVar47 = vfmadd231ps_fma(auVar47,auVar52,auVar120);
        auVar62 = vmulps_avx512vl(auVar52,auVar164);
        auVar211._8_8_ = auVar47._0_8_;
        auVar211._0_8_ = auVar47._0_8_;
        auVar52 = vshufpd_avx(auVar47,auVar47,3);
        auVar47 = vshufps_avx(auVar57,auVar57,0x55);
        auVar53 = vsubps_avx(auVar52,auVar211);
        auVar54 = vfmadd231ps_fma(auVar211,auVar47,auVar53);
        auVar231._8_8_ = auVar62._0_8_;
        auVar231._0_8_ = auVar62._0_8_;
        auVar52 = vshufpd_avx(auVar62,auVar62,3);
        auVar52 = vsubps_avx(auVar52,auVar231);
        auVar47 = vfmadd213ps_fma(auVar52,auVar47,auVar231);
        auVar121._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
        auVar121._8_4_ = auVar53._8_4_ ^ 0x80000000;
        auVar121._12_4_ = auVar53._12_4_ ^ 0x80000000;
        auVar52 = vmovshdup_avx(auVar47);
        auVar232._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar232._8_4_ = auVar52._8_4_ ^ 0x80000000;
        auVar232._12_4_ = auVar52._12_4_ ^ 0x80000000;
        auVar62 = vmovshdup_avx512vl(auVar53);
        auVar63 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar53);
        auVar52 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar53._0_4_)),auVar47,auVar62
                                     );
        auVar47 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar121);
        auVar131._0_4_ = auVar52._0_4_;
        auVar131._4_4_ = auVar131._0_4_;
        auVar131._8_4_ = auVar131._0_4_;
        auVar131._12_4_ = auVar131._0_4_;
        auVar52 = vdivps_avx(auVar63,auVar131);
        auVar47 = vdivps_avx(auVar47,auVar131);
        fVar184 = auVar54._0_4_;
        auVar53 = vshufps_avx(auVar54,auVar54,0x55);
        fVar100 = auVar47._0_4_;
        auVar212._0_4_ = fVar184 * auVar52._0_4_ + auVar53._0_4_ * fVar100;
        auVar212._4_4_ = fVar184 * auVar52._4_4_ + auVar53._4_4_ * auVar47._4_4_;
        auVar212._8_4_ = fVar184 * auVar52._8_4_ + auVar53._8_4_ * auVar47._8_4_;
        auVar212._12_4_ = fVar184 * auVar52._12_4_ + auVar53._12_4_ * auVar47._12_4_;
        auVar58 = vsubps_avx(auVar55,auVar212);
        auVar54 = vmovshdup_avx(auVar52);
        auVar55 = vinsertps_avx(auVar170,auVar192,0x1c);
        auVar233._0_4_ = auVar54._0_4_ * auVar55._0_4_;
        auVar233._4_4_ = auVar54._4_4_ * auVar55._4_4_;
        auVar233._8_4_ = auVar54._8_4_ * auVar55._8_4_;
        auVar233._12_4_ = auVar54._12_4_ * auVar55._12_4_;
        auVar53 = vinsertps_avx(auVar157,auVar202,0x1c);
        auVar213._0_4_ = auVar54._0_4_ * auVar53._0_4_;
        auVar213._4_4_ = auVar54._4_4_ * auVar53._4_4_;
        auVar213._8_4_ = auVar54._8_4_ * auVar53._8_4_;
        auVar213._12_4_ = auVar54._12_4_ * auVar53._12_4_;
        auVar56 = vminps_avx512vl(auVar233,auVar213);
        auVar63 = vmaxps_avx(auVar213,auVar233);
        auVar61 = vmovshdup_avx(auVar47);
        auVar54 = vinsertps_avx(auVar192,auVar170,0x4c);
        auVar193._0_4_ = auVar61._0_4_ * auVar54._0_4_;
        auVar193._4_4_ = auVar61._4_4_ * auVar54._4_4_;
        auVar193._8_4_ = auVar61._8_4_ * auVar54._8_4_;
        auVar193._12_4_ = auVar61._12_4_ * auVar54._12_4_;
        auVar62 = vinsertps_avx(auVar202,auVar157,0x4c);
        auVar203._0_4_ = auVar61._0_4_ * auVar62._0_4_;
        auVar203._4_4_ = auVar61._4_4_ * auVar62._4_4_;
        auVar203._8_4_ = auVar61._8_4_ * auVar62._8_4_;
        auVar203._12_4_ = auVar61._12_4_ * auVar62._12_4_;
        auVar61 = vminps_avx(auVar193,auVar203);
        auVar56 = vaddps_avx512vl(auVar56,auVar61);
        auVar61 = vmaxps_avx(auVar203,auVar193);
        auVar194._0_4_ = auVar63._0_4_ + auVar61._0_4_;
        auVar194._4_4_ = auVar63._4_4_ + auVar61._4_4_;
        auVar194._8_4_ = auVar63._8_4_ + auVar61._8_4_;
        auVar194._12_4_ = auVar63._12_4_ + auVar61._12_4_;
        auVar204._8_8_ = 0x3f80000000000000;
        auVar204._0_8_ = 0x3f80000000000000;
        auVar63 = vsubps_avx(auVar204,auVar194);
        auVar61 = vsubps_avx(auVar204,auVar56);
        auVar56 = vsubps_avx(auVar148,auVar57);
        auVar57 = vsubps_avx(auVar65,auVar57);
        fVar216 = auVar56._0_4_;
        auVar234._0_4_ = fVar216 * auVar63._0_4_;
        fVar217 = auVar56._4_4_;
        auVar234._4_4_ = fVar217 * auVar63._4_4_;
        fVar218 = auVar56._8_4_;
        auVar234._8_4_ = fVar218 * auVar63._8_4_;
        fVar219 = auVar56._12_4_;
        auVar234._12_4_ = fVar219 * auVar63._12_4_;
        auVar64 = vbroadcastss_avx512vl(auVar52);
        auVar55 = vmulps_avx512vl(auVar64,auVar55);
        auVar53 = vmulps_avx512vl(auVar64,auVar53);
        auVar64 = vminps_avx512vl(auVar55,auVar53);
        auVar55 = vmaxps_avx(auVar53,auVar55);
        auVar171._0_4_ = fVar100 * auVar54._0_4_;
        auVar171._4_4_ = fVar100 * auVar54._4_4_;
        auVar171._8_4_ = fVar100 * auVar54._8_4_;
        auVar171._12_4_ = fVar100 * auVar54._12_4_;
        auVar158._0_4_ = fVar100 * auVar62._0_4_;
        auVar158._4_4_ = fVar100 * auVar62._4_4_;
        auVar158._8_4_ = fVar100 * auVar62._8_4_;
        auVar158._12_4_ = fVar100 * auVar62._12_4_;
        auVar53 = vminps_avx(auVar171,auVar158);
        auVar54 = vaddps_avx512vl(auVar64,auVar53);
        auVar62 = vmulps_avx512vl(auVar56,auVar61);
        fVar184 = auVar57._0_4_;
        auVar195._0_4_ = fVar184 * auVar63._0_4_;
        fVar199 = auVar57._4_4_;
        auVar195._4_4_ = fVar199 * auVar63._4_4_;
        fVar200 = auVar57._8_4_;
        auVar195._8_4_ = fVar200 * auVar63._8_4_;
        fVar207 = auVar57._12_4_;
        auVar195._12_4_ = fVar207 * auVar63._12_4_;
        auVar205._0_4_ = fVar184 * auVar61._0_4_;
        auVar205._4_4_ = fVar199 * auVar61._4_4_;
        auVar205._8_4_ = fVar200 * auVar61._8_4_;
        auVar205._12_4_ = fVar207 * auVar61._12_4_;
        auVar53 = vmaxps_avx(auVar158,auVar171);
        auVar159._0_4_ = auVar55._0_4_ + auVar53._0_4_;
        auVar159._4_4_ = auVar55._4_4_ + auVar53._4_4_;
        auVar159._8_4_ = auVar55._8_4_ + auVar53._8_4_;
        auVar159._12_4_ = auVar55._12_4_ + auVar53._12_4_;
        auVar172._8_8_ = 0x3f800000;
        auVar172._0_8_ = 0x3f800000;
        auVar55 = vsubps_avx(auVar172,auVar159);
        auVar53 = vsubps_avx(auVar172,auVar54);
        auVar223._0_4_ = fVar216 * auVar55._0_4_;
        auVar223._4_4_ = fVar217 * auVar55._4_4_;
        auVar223._8_4_ = fVar218 * auVar55._8_4_;
        auVar223._12_4_ = fVar219 * auVar55._12_4_;
        auVar214._0_4_ = fVar216 * auVar53._0_4_;
        auVar214._4_4_ = fVar217 * auVar53._4_4_;
        auVar214._8_4_ = fVar218 * auVar53._8_4_;
        auVar214._12_4_ = fVar219 * auVar53._12_4_;
        auVar160._0_4_ = fVar184 * auVar55._0_4_;
        auVar160._4_4_ = fVar199 * auVar55._4_4_;
        auVar160._8_4_ = fVar200 * auVar55._8_4_;
        auVar160._12_4_ = fVar207 * auVar55._12_4_;
        auVar173._0_4_ = fVar184 * auVar53._0_4_;
        auVar173._4_4_ = fVar199 * auVar53._4_4_;
        auVar173._8_4_ = fVar200 * auVar53._8_4_;
        auVar173._12_4_ = fVar207 * auVar53._12_4_;
        auVar55 = vminps_avx(auVar223,auVar214);
        auVar53 = vminps_avx(auVar160,auVar173);
        auVar54 = vminps_avx(auVar55,auVar53);
        auVar55 = vmaxps_avx(auVar214,auVar223);
        auVar53 = vmaxps_avx(auVar173,auVar160);
        auVar53 = vmaxps_avx(auVar53,auVar55);
        auVar63 = vminps_avx512vl(auVar234,auVar62);
        auVar55 = vminps_avx(auVar195,auVar205);
        auVar55 = vminps_avx(auVar63,auVar55);
        auVar55 = vhaddps_avx(auVar54,auVar55);
        auVar62 = vmaxps_avx512vl(auVar62,auVar234);
        auVar54 = vmaxps_avx(auVar205,auVar195);
        auVar54 = vmaxps_avx(auVar54,auVar62);
        auVar53 = vhaddps_avx(auVar53,auVar54);
        auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
        auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
        auVar161._0_4_ = auVar55._0_4_ + auVar58._0_4_;
        auVar161._4_4_ = auVar55._4_4_ + auVar58._4_4_;
        auVar161._8_4_ = auVar55._8_4_ + auVar58._8_4_;
        auVar161._12_4_ = auVar55._12_4_ + auVar58._12_4_;
        auVar174._0_4_ = auVar53._0_4_ + auVar58._0_4_;
        auVar174._4_4_ = auVar53._4_4_ + auVar58._4_4_;
        auVar174._8_4_ = auVar53._8_4_ + auVar58._8_4_;
        auVar174._12_4_ = auVar53._12_4_ + auVar58._12_4_;
        auVar55 = vmaxps_avx(auVar148,auVar161);
        auVar53 = vminps_avx(auVar174,auVar65);
        uVar38 = vcmpps_avx512vl(auVar53,auVar55,1);
        local_348 = vinsertps_avx(auVar59,auVar60,0x10);
        auVar236 = ZEXT1664(local_348);
        auVar55 = ZEXT416(5);
        if ((uVar38 & 3) == 0) {
          vucomiss_avx512f(auVar41);
          auVar55 = vxorps_avx512vl(auVar55,auVar55);
          auVar246 = ZEXT1664(auVar55);
          if ((uint)uVar31 < 4 && (uVar6 == 0 || lVar35 == 0)) {
            bVar13 = false;
          }
          else {
            lVar35 = 200;
            do {
              auVar53 = vsubss_avx512f(auVar40,auVar58);
              fVar200 = auVar53._0_4_;
              fVar184 = fVar200 * fVar200 * fVar200;
              fVar207 = auVar58._0_4_;
              fVar199 = fVar207 * 3.0 * fVar200 * fVar200;
              fVar200 = fVar200 * fVar207 * fVar207 * 3.0;
              auVar146._4_4_ = fVar184;
              auVar146._0_4_ = fVar184;
              auVar146._8_4_ = fVar184;
              auVar146._12_4_ = fVar184;
              auVar137._4_4_ = fVar199;
              auVar137._0_4_ = fVar199;
              auVar137._8_4_ = fVar199;
              auVar137._12_4_ = fVar199;
              auVar111._4_4_ = fVar200;
              auVar111._0_4_ = fVar200;
              auVar111._8_4_ = fVar200;
              auVar111._12_4_ = fVar200;
              fVar207 = fVar207 * fVar207 * fVar207;
              auVar151._0_4_ = (float)local_328._0_4_ * fVar207;
              auVar151._4_4_ = (float)local_328._4_4_ * fVar207;
              auVar151._8_4_ = fStack_320 * fVar207;
              auVar151._12_4_ = fStack_31c * fVar207;
              auVar53 = vfmadd231ps_fma(auVar151,auVar45,auVar111);
              auVar53 = vfmadd231ps_fma(auVar53,auVar49,auVar137);
              auVar53 = vfmadd231ps_fma(auVar53,auVar3,auVar146);
              auVar112._8_8_ = auVar53._0_8_;
              auVar112._0_8_ = auVar53._0_8_;
              auVar53 = vshufpd_avx(auVar53,auVar53,3);
              auVar65 = vshufps_avx(auVar58,auVar58,0x55);
              auVar53 = vsubps_avx(auVar53,auVar112);
              auVar65 = vfmadd213ps_fma(auVar53,auVar65,auVar112);
              fVar184 = auVar65._0_4_;
              auVar53 = vshufps_avx(auVar65,auVar65,0x55);
              auVar113._0_4_ = auVar52._0_4_ * fVar184 + fVar100 * auVar53._0_4_;
              auVar113._4_4_ = auVar52._4_4_ * fVar184 + auVar47._4_4_ * auVar53._4_4_;
              auVar113._8_4_ = auVar52._8_4_ * fVar184 + auVar47._8_4_ * auVar53._8_4_;
              auVar113._12_4_ = auVar52._12_4_ * fVar184 + auVar47._12_4_ * auVar53._12_4_;
              auVar58 = vsubps_avx(auVar58,auVar113);
              auVar53 = vandps_avx512vl(auVar65,auVar239._0_16_);
              auVar65 = vprolq_avx512vl(auVar53,0x20);
              auVar53 = vmaxss_avx(auVar65,auVar53);
              bVar14 = auVar53._0_4_ <= (float)local_338._0_4_;
              if (auVar53._0_4_ < (float)local_338._0_4_) {
                auVar52 = vucomiss_avx512f(auVar55);
                if (bVar14) {
                  auVar40 = vucomiss_avx512f(auVar52);
                  auVar241 = ZEXT1664(auVar40);
                  if (bVar14) {
                    vmovshdup_avx(auVar52);
                    auVar40 = vucomiss_avx512f(auVar55);
                    if (bVar14) {
                      auVar47 = vucomiss_avx512f(auVar40);
                      auVar241 = ZEXT1664(auVar47);
                      if (bVar14) {
                        auVar53 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar57 = vinsertps_avx(auVar53,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar53 = vdpps_avx(auVar57,local_188,0x7f);
                        auVar65 = vdpps_avx(auVar57,local_198,0x7f);
                        auVar54 = vdpps_avx(auVar57,local_1a8,0x7f);
                        auVar62 = vdpps_avx(auVar57,local_1b8,0x7f);
                        auVar63 = vdpps_avx(auVar57,local_1c8,0x7f);
                        auVar61 = vdpps_avx(auVar57,local_1d8,0x7f);
                        auVar56 = vdpps_avx(auVar57,local_1e8,0x7f);
                        auVar57 = vdpps_avx(auVar57,local_1f8,0x7f);
                        auVar58 = vsubss_avx512f(auVar47,auVar40);
                        fVar200 = auVar40._0_4_;
                        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar63._0_4_)),auVar58,
                                                  auVar53);
                        auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar200)),auVar58,
                                                  auVar65);
                        auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar200)),auVar58,
                                                  auVar54);
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar57._0_4_)),auVar58,
                                                  auVar62);
                        auVar47 = vsubss_avx512f(auVar47,auVar52);
                        auVar181._0_4_ = auVar47._0_4_;
                        fVar100 = auVar181._0_4_ * auVar181._0_4_ * auVar181._0_4_;
                        local_118 = auVar52._0_4_;
                        fVar184 = local_118 * 3.0 * auVar181._0_4_ * auVar181._0_4_;
                        fVar199 = auVar181._0_4_ * local_118 * local_118 * 3.0;
                        fVar216 = local_118 * local_118 * local_118;
                        auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar54._0_4_)),
                                                  ZEXT416((uint)fVar199),auVar65);
                        auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar184),auVar53);
                        auVar40 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar100),auVar40);
                        fVar207 = auVar40._0_4_;
                        if ((fVar126 <= fVar207) &&
                           (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar207 <= fVar217)) {
                          local_108 = vshufps_avx(auVar52,auVar52,0x55);
                          auVar47 = vsubps_avx512vl(auVar48,local_108);
                          fVar218 = local_108._0_4_;
                          auVar196._0_4_ = fVar218 * (float)local_218._0_4_;
                          fVar219 = local_108._4_4_;
                          auVar196._4_4_ = fVar219 * (float)local_218._4_4_;
                          fVar227 = local_108._8_4_;
                          auVar196._8_4_ = fVar227 * fStack_210;
                          fVar228 = local_108._12_4_;
                          auVar196._12_4_ = fVar228 * fStack_20c;
                          auVar206._0_4_ = fVar218 * (float)local_268._0_4_;
                          auVar206._4_4_ = fVar219 * (float)local_268._4_4_;
                          auVar206._8_4_ = fVar227 * fStack_260;
                          auVar206._12_4_ = fVar228 * fStack_25c;
                          auVar215._0_4_ = fVar218 * (float)local_278._0_4_;
                          auVar215._4_4_ = fVar219 * (float)local_278._4_4_;
                          auVar215._8_4_ = fVar227 * fStack_270;
                          auVar215._12_4_ = fVar228 * fStack_26c;
                          auVar224._0_4_ = fVar218 * (float)local_238._0_4_;
                          auVar224._4_4_ = fVar219 * (float)local_238._4_4_;
                          auVar224._8_4_ = fVar227 * fStack_230;
                          auVar224._12_4_ = fVar228 * fStack_22c;
                          auVar48 = vfmadd231ps_fma(auVar196,auVar47,local_208);
                          auVar52 = vfmadd231ps_fma(auVar206,auVar47,local_248);
                          auVar40 = vfmadd231ps_fma(auVar215,auVar47,local_258);
                          auVar47 = vfmadd231ps_fma(auVar224,auVar47,local_228);
                          auVar48 = vsubps_avx(auVar52,auVar48);
                          auVar52 = vsubps_avx(auVar40,auVar52);
                          auVar40 = vsubps_avx(auVar47,auVar40);
                          auVar225._0_4_ = local_118 * auVar52._0_4_;
                          auVar225._4_4_ = local_118 * auVar52._4_4_;
                          auVar225._8_4_ = local_118 * auVar52._8_4_;
                          auVar225._12_4_ = local_118 * auVar52._12_4_;
                          auVar181._4_4_ = auVar181._0_4_;
                          auVar181._8_4_ = auVar181._0_4_;
                          auVar181._12_4_ = auVar181._0_4_;
                          auVar48 = vfmadd231ps_fma(auVar225,auVar181,auVar48);
                          auVar197._0_4_ = local_118 * auVar40._0_4_;
                          auVar197._4_4_ = local_118 * auVar40._4_4_;
                          auVar197._8_4_ = local_118 * auVar40._8_4_;
                          auVar197._12_4_ = local_118 * auVar40._12_4_;
                          auVar52 = vfmadd231ps_fma(auVar197,auVar181,auVar52);
                          auVar198._0_4_ = local_118 * auVar52._0_4_;
                          auVar198._4_4_ = local_118 * auVar52._4_4_;
                          auVar198._8_4_ = local_118 * auVar52._8_4_;
                          auVar198._12_4_ = local_118 * auVar52._12_4_;
                          auVar48 = vfmadd231ps_fma(auVar198,auVar181,auVar48);
                          auVar48 = vmulps_avx512vl(auVar48,auVar164);
                          pGVar7 = (context->scene->geometries).items[uVar36].ptr;
                          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                            auVar162._0_4_ = fVar216 * (float)local_2b8._0_4_;
                            auVar162._4_4_ = fVar216 * (float)local_2b8._4_4_;
                            auVar162._8_4_ = fVar216 * fStack_2b0;
                            auVar162._12_4_ = fVar216 * fStack_2ac;
                            auVar152._4_4_ = fVar199;
                            auVar152._0_4_ = fVar199;
                            auVar152._8_4_ = fVar199;
                            auVar152._12_4_ = fVar199;
                            auVar52 = vfmadd132ps_fma(auVar152,auVar162,local_2a8);
                            auVar147._4_4_ = fVar184;
                            auVar147._0_4_ = fVar184;
                            auVar147._8_4_ = fVar184;
                            auVar147._12_4_ = fVar184;
                            auVar52 = vfmadd132ps_fma(auVar147,auVar52,local_298);
                            auVar138._4_4_ = fVar100;
                            auVar138._0_4_ = fVar100;
                            auVar138._8_4_ = fVar100;
                            auVar138._12_4_ = fVar100;
                            auVar47 = vfmadd132ps_fma(auVar138,auVar52,local_288);
                            auVar52 = vshufps_avx(auVar47,auVar47,0xc9);
                            auVar40 = vshufps_avx(auVar48,auVar48,0xc9);
                            auVar139._0_4_ = auVar47._0_4_ * auVar40._0_4_;
                            auVar139._4_4_ = auVar47._4_4_ * auVar40._4_4_;
                            auVar139._8_4_ = auVar47._8_4_ * auVar40._8_4_;
                            auVar139._12_4_ = auVar47._12_4_ * auVar40._12_4_;
                            auVar48 = vfmsub231ps_fma(auVar139,auVar48,auVar52);
                            local_128 = auVar48._0_4_;
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              *(float *)(ray + k * 4 + 0x80) = fVar207;
                              uVar106 = vextractps_avx(auVar48,1);
                              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar106;
                              uVar106 = vextractps_avx(auVar48,2);
                              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar106;
                              *(undefined4 *)(ray + k * 4 + 0xe0) = local_128;
                              *(float *)(ray + k * 4 + 0xf0) = local_118;
                              *(float *)(ray + k * 4 + 0x100) = fVar200;
                              *(uint *)(ray + k * 4 + 0x110) = uVar5;
                              *(uint *)(ray + k * 4 + 0x120) = uVar36;
                              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                            }
                            else {
                              auVar52 = vshufps_avx(auVar48,auVar48,0x55);
                              local_138 = vshufps_avx(auVar48,auVar48,0xaa);
                              local_148[0] = (RTCHitN)auVar52[0];
                              local_148[1] = (RTCHitN)auVar52[1];
                              local_148[2] = (RTCHitN)auVar52[2];
                              local_148[3] = (RTCHitN)auVar52[3];
                              local_148[4] = (RTCHitN)auVar52[4];
                              local_148[5] = (RTCHitN)auVar52[5];
                              local_148[6] = (RTCHitN)auVar52[6];
                              local_148[7] = (RTCHitN)auVar52[7];
                              local_148[8] = (RTCHitN)auVar52[8];
                              local_148[9] = (RTCHitN)auVar52[9];
                              local_148[10] = (RTCHitN)auVar52[10];
                              local_148[0xb] = (RTCHitN)auVar52[0xb];
                              local_148[0xc] = (RTCHitN)auVar52[0xc];
                              local_148[0xd] = (RTCHitN)auVar52[0xd];
                              local_148[0xe] = (RTCHitN)auVar52[0xe];
                              local_148[0xf] = (RTCHitN)auVar52[0xf];
                              uStack_124 = local_128;
                              uStack_120 = local_128;
                              uStack_11c = local_128;
                              fStack_114 = local_118;
                              fStack_110 = local_118;
                              fStack_10c = local_118;
                              local_f8 = local_2d8._0_8_;
                              uStack_f0 = local_2d8._8_8_;
                              local_e8 = local_2c8;
                              vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                              uStack_d4 = context->user->instID[0];
                              local_d8 = uStack_d4;
                              uStack_d0 = uStack_d4;
                              uStack_cc = uStack_d4;
                              uStack_c8 = context->user->instPrimID[0];
                              uStack_c4 = uStack_c8;
                              uStack_c0 = uStack_c8;
                              uStack_bc = uStack_c8;
                              *(float *)(ray + k * 4 + 0x80) = fVar207;
                              local_398 = local_2e8._0_8_;
                              uStack_390 = local_2e8._8_8_;
                              local_378.valid = (int *)&local_398;
                              local_378.geometryUserPtr = pGVar7->userPtr;
                              local_378.context = context->user;
                              local_378.hit = local_148;
                              local_378.N = 4;
                              local_378.ray = (RTCRayN *)ray;
                              if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                local_380 = context;
                                (*pGVar7->intersectionFilterN)(&local_378);
                                auVar236 = ZEXT1664(local_348);
                                auVar48 = vxorps_avx512vl(auVar55,auVar55);
                                auVar246 = ZEXT1664(auVar48);
                                auVar241 = ZEXT464(0x3f800000);
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar238 = ZEXT3264(auVar74);
                                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar240 = ZEXT1664(auVar48);
                                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar239 = ZEXT1664(auVar48);
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar244 = ZEXT3264(auVar74);
                                auVar74 = vbroadcastss_avx512vl(ZEXT416(1));
                                auVar243 = ZEXT3264(auVar74);
                                context = local_380;
                              }
                              auVar48 = auVar246._0_16_;
                              auVar27._8_8_ = uStack_390;
                              auVar27._0_8_ = local_398;
                              uVar38 = vptestmd_avx512vl(auVar27,auVar27);
                              if ((uVar38 & 0xf) == 0) {
LAB_01d99c9e:
                                *(float *)(ray + k * 4 + 0x80) = fVar217;
                              }
                              else {
                                p_Var10 = context->args->filter;
                                if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var10)(&local_378);
                                  auVar236 = ZEXT1664(local_348);
                                  auVar48 = vxorps_avx512vl(auVar48,auVar48);
                                  auVar246 = ZEXT1664(auVar48);
                                  auVar241 = ZEXT464(0x3f800000);
                                  auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar238 = ZEXT3264(auVar74);
                                  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar240 = ZEXT1664(auVar48);
                                  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar239 = ZEXT1664(auVar48);
                                  auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar244 = ZEXT3264(auVar74);
                                  auVar74 = vbroadcastss_avx512vl(ZEXT416(1));
                                  auVar243 = ZEXT3264(auVar74);
                                }
                                auVar28._8_8_ = uStack_390;
                                auVar28._0_8_ = local_398;
                                uVar38 = vptestmd_avx512vl(auVar28,auVar28);
                                uVar38 = uVar38 & 0xf;
                                bVar29 = (byte)uVar38;
                                if (bVar29 == 0) goto LAB_01d99c9e;
                                iVar99 = *(int *)(local_378.hit + 4);
                                iVar245 = *(int *)(local_378.hit + 8);
                                iVar26 = *(int *)(local_378.hit + 0xc);
                                bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                                bVar12 = SUB81(uVar38 >> 3,0);
                                *(uint *)(local_378.ray + 0xc0) =
                                     (uint)(bVar29 & 1) * *(int *)local_378.hit |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xc0);
                                *(uint *)(local_378.ray + 0xc4) =
                                     (uint)bVar14 * iVar99 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xc4);
                                *(uint *)(local_378.ray + 200) =
                                     (uint)bVar11 * iVar245 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 200);
                                *(uint *)(local_378.ray + 0xcc) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xcc);
                                iVar99 = *(int *)(local_378.hit + 0x14);
                                iVar245 = *(int *)(local_378.hit + 0x18);
                                iVar26 = *(int *)(local_378.hit + 0x1c);
                                bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                                bVar12 = SUB81(uVar38 >> 3,0);
                                *(uint *)(local_378.ray + 0xd0) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x10) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xd0);
                                *(uint *)(local_378.ray + 0xd4) =
                                     (uint)bVar14 * iVar99 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xd4);
                                *(uint *)(local_378.ray + 0xd8) =
                                     (uint)bVar11 * iVar245 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0xd8);
                                *(uint *)(local_378.ray + 0xdc) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xdc);
                                iVar99 = *(int *)(local_378.hit + 0x24);
                                iVar245 = *(int *)(local_378.hit + 0x28);
                                iVar26 = *(int *)(local_378.hit + 0x2c);
                                bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                                bVar12 = SUB81(uVar38 >> 3,0);
                                *(uint *)(local_378.ray + 0xe0) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x20) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xe0);
                                *(uint *)(local_378.ray + 0xe4) =
                                     (uint)bVar14 * iVar99 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xe4);
                                *(uint *)(local_378.ray + 0xe8) =
                                     (uint)bVar11 * iVar245 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0xe8);
                                *(uint *)(local_378.ray + 0xec) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xec);
                                iVar99 = *(int *)(local_378.hit + 0x34);
                                iVar245 = *(int *)(local_378.hit + 0x38);
                                iVar26 = *(int *)(local_378.hit + 0x3c);
                                bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                                bVar12 = SUB81(uVar38 >> 3,0);
                                *(uint *)(local_378.ray + 0xf0) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x30) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0xf0);
                                *(uint *)(local_378.ray + 0xf4) =
                                     (uint)bVar14 * iVar99 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0xf4);
                                *(uint *)(local_378.ray + 0xf8) =
                                     (uint)bVar11 * iVar245 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0xf8);
                                *(uint *)(local_378.ray + 0xfc) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0xfc);
                                iVar99 = *(int *)(local_378.hit + 0x44);
                                iVar245 = *(int *)(local_378.hit + 0x48);
                                iVar26 = *(int *)(local_378.hit + 0x4c);
                                bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
                                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                                bVar12 = SUB81(uVar38 >> 3,0);
                                *(uint *)(local_378.ray + 0x100) =
                                     (uint)(bVar29 & 1) * *(int *)(local_378.hit + 0x40) |
                                     (uint)!(bool)(bVar29 & 1) * *(int *)(local_378.ray + 0x100);
                                *(uint *)(local_378.ray + 0x104) =
                                     (uint)bVar14 * iVar99 |
                                     (uint)!bVar14 * *(int *)(local_378.ray + 0x104);
                                *(uint *)(local_378.ray + 0x108) =
                                     (uint)bVar11 * iVar245 |
                                     (uint)!bVar11 * *(int *)(local_378.ray + 0x108);
                                *(uint *)(local_378.ray + 0x10c) =
                                     (uint)bVar12 * iVar26 |
                                     (uint)!bVar12 * *(int *)(local_378.ray + 0x10c);
                                auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x50));
                                *(undefined1 (*) [16])(local_378.ray + 0x110) = auVar48;
                                auVar48 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x60));
                                *(undefined1 (*) [16])(local_378.ray + 0x120) = auVar48;
                                auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x70));
                                *(undefined1 (*) [16])(local_378.ray + 0x130) = auVar48;
                                auVar48 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_378.hit + 0x80));
                                *(undefined1 (*) [16])(local_378.ray + 0x140) = auVar48;
                              }
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar237 = ZEXT1664(auVar48);
                              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar242 = ZEXT1664(auVar48);
                            }
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar35 = lVar35 + -1;
            } while (lVar35 != 0);
          }
        }
        else {
          auVar48 = vxorps_avx512vl(ZEXT416(5),auVar55);
          auVar246 = ZEXT1664(auVar48);
        }
      }
    } while (bVar13);
    auVar48 = vinsertps_avx512f(auVar41,auVar51,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }